

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  Primitive PVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [12];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  byte bVar65;
  byte bVar66;
  byte bVar67;
  ulong uVar68;
  int iVar69;
  ulong uVar70;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  uint uVar71;
  long lVar72;
  byte bVar73;
  undefined1 uVar74;
  undefined1 uVar75;
  byte bVar76;
  ulong uVar77;
  uint uVar78;
  uint uVar79;
  uint uVar130;
  uint uVar131;
  uint uVar133;
  uint uVar134;
  uint uVar135;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  uint uVar132;
  uint uVar136;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar89 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float pp;
  float fVar137;
  undefined4 uVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar151;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  float fVar152;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar162 [32];
  undefined1 auVar153 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar204;
  float fVar205;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar228 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  undefined4 uVar235;
  undefined4 uVar236;
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [16];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 local_9d0 [16];
  ulong local_9b8;
  uint local_9ac;
  float local_9a8;
  float local_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  RTCFilterFunctionNArguments local_870;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  Primitive *local_610;
  ulong local_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  RTCHitN local_460 [16];
  undefined1 auStack_450 [16];
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  float local_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [16];
  undefined8 local_410;
  undefined8 uStack_408;
  undefined1 local_400 [16];
  uint local_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  uint uStack_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_330 [16];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  
  PVar5 = prim[1];
  uVar77 = (ulong)(byte)PVar5;
  fVar205 = *(float *)(prim + uVar77 * 0x19 + 0x12);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar88 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar89 = vsubps_avx(auVar82,*(undefined1 (*) [16])(prim + uVar77 * 0x19 + 6));
  fVar204 = fVar205 * auVar89._0_4_;
  fVar137 = fVar205 * auVar88._0_4_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar77 * 4 + 6);
  auVar95 = vpmovsxbd_avx2(auVar82);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar77 * 5 + 6);
  auVar93 = vpmovsxbd_avx2(auVar85);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar77 * 6 + 6);
  auVar96 = vpmovsxbd_avx2(auVar83);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar77 * 0xb + 6);
  auVar97 = vpmovsxbd_avx2(auVar84);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  auVar102 = vpmovsxbd_avx2(auVar80);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar98 = vcvtdq2ps_avx(auVar102);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + (uint)(byte)PVar5 * 0xc + uVar77 + 6);
  auVar94 = vpmovsxbd_avx2(auVar86);
  auVar94 = vcvtdq2ps_avx(auVar94);
  uVar68 = (ulong)(uint)((int)(uVar77 * 9) * 2);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar68 + 6);
  auVar99 = vpmovsxbd_avx2(auVar87);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar68 + uVar77 + 6);
  auVar100 = vpmovsxbd_avx2(auVar81);
  auVar100 = vcvtdq2ps_avx(auVar100);
  uVar70 = (ulong)(uint)((int)(uVar77 * 5) << 2);
  auVar250._8_8_ = 0;
  auVar250._0_8_ = *(ulong *)(prim + uVar70 + 6);
  auVar92 = vpmovsxbd_avx2(auVar250);
  auVar101 = vcvtdq2ps_avx(auVar92);
  auVar112._4_4_ = fVar137;
  auVar112._0_4_ = fVar137;
  auVar112._8_4_ = fVar137;
  auVar112._12_4_ = fVar137;
  auVar112._16_4_ = fVar137;
  auVar112._20_4_ = fVar137;
  auVar112._24_4_ = fVar137;
  auVar112._28_4_ = fVar137;
  auVar113._8_4_ = 1;
  auVar113._0_8_ = 0x100000001;
  auVar113._12_4_ = 1;
  auVar113._16_4_ = 1;
  auVar113._20_4_ = 1;
  auVar113._24_4_ = 1;
  auVar113._28_4_ = 1;
  auVar90 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar104 = ZEXT1632(CONCAT412(fVar205 * auVar88._12_4_,
                                CONCAT48(fVar205 * auVar88._8_4_,
                                         CONCAT44(fVar205 * auVar88._4_4_,fVar137))));
  auVar103 = vpermps_avx2(auVar113,auVar104);
  auVar91 = vpermps_avx512vl(auVar90,auVar104);
  fVar137 = auVar91._0_4_;
  fVar166 = auVar91._4_4_;
  auVar104._4_4_ = fVar166 * auVar96._4_4_;
  auVar104._0_4_ = fVar137 * auVar96._0_4_;
  fVar168 = auVar91._8_4_;
  auVar104._8_4_ = fVar168 * auVar96._8_4_;
  fVar170 = auVar91._12_4_;
  auVar104._12_4_ = fVar170 * auVar96._12_4_;
  fVar151 = auVar91._16_4_;
  auVar104._16_4_ = fVar151 * auVar96._16_4_;
  fVar172 = auVar91._20_4_;
  auVar104._20_4_ = fVar172 * auVar96._20_4_;
  fVar174 = auVar91._24_4_;
  auVar104._24_4_ = fVar174 * auVar96._24_4_;
  auVar104._28_4_ = auVar102._28_4_;
  auVar102._4_4_ = auVar94._4_4_ * fVar166;
  auVar102._0_4_ = auVar94._0_4_ * fVar137;
  auVar102._8_4_ = auVar94._8_4_ * fVar168;
  auVar102._12_4_ = auVar94._12_4_ * fVar170;
  auVar102._16_4_ = auVar94._16_4_ * fVar151;
  auVar102._20_4_ = auVar94._20_4_ * fVar172;
  auVar102._24_4_ = auVar94._24_4_ * fVar174;
  auVar102._28_4_ = auVar92._28_4_;
  auVar92._4_4_ = auVar101._4_4_ * fVar166;
  auVar92._0_4_ = auVar101._0_4_ * fVar137;
  auVar92._8_4_ = auVar101._8_4_ * fVar168;
  auVar92._12_4_ = auVar101._12_4_ * fVar170;
  auVar92._16_4_ = auVar101._16_4_ * fVar151;
  auVar92._20_4_ = auVar101._20_4_ * fVar172;
  auVar92._24_4_ = auVar101._24_4_ * fVar174;
  auVar92._28_4_ = auVar91._28_4_;
  auVar82 = vfmadd231ps_fma(auVar104,auVar103,auVar93);
  auVar85 = vfmadd231ps_fma(auVar102,auVar103,auVar98);
  auVar83 = vfmadd231ps_fma(auVar92,auVar100,auVar103);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar112,auVar95);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar112,auVar97);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar99,auVar112);
  auVar215._4_4_ = fVar204;
  auVar215._0_4_ = fVar204;
  auVar215._8_4_ = fVar204;
  auVar215._12_4_ = fVar204;
  auVar215._16_4_ = fVar204;
  auVar215._20_4_ = fVar204;
  auVar215._24_4_ = fVar204;
  auVar215._28_4_ = fVar204;
  auVar92 = ZEXT1632(CONCAT412(fVar205 * auVar89._12_4_,
                               CONCAT48(fVar205 * auVar89._8_4_,
                                        CONCAT44(fVar205 * auVar89._4_4_,fVar204))));
  auVar102 = vpermps_avx2(auVar113,auVar92);
  auVar92 = vpermps_avx512vl(auVar90,auVar92);
  fVar205 = auVar92._0_4_;
  fVar137 = auVar92._4_4_;
  auVar103._4_4_ = fVar137 * auVar96._4_4_;
  auVar103._0_4_ = fVar205 * auVar96._0_4_;
  fVar166 = auVar92._8_4_;
  auVar103._8_4_ = fVar166 * auVar96._8_4_;
  fVar168 = auVar92._12_4_;
  auVar103._12_4_ = fVar168 * auVar96._12_4_;
  fVar170 = auVar92._16_4_;
  auVar103._16_4_ = fVar170 * auVar96._16_4_;
  fVar151 = auVar92._20_4_;
  auVar103._20_4_ = fVar151 * auVar96._20_4_;
  fVar172 = auVar92._24_4_;
  auVar103._24_4_ = fVar172 * auVar96._24_4_;
  auVar103._28_4_ = 1;
  auVar90._4_4_ = auVar94._4_4_ * fVar137;
  auVar90._0_4_ = auVar94._0_4_ * fVar205;
  auVar90._8_4_ = auVar94._8_4_ * fVar166;
  auVar90._12_4_ = auVar94._12_4_ * fVar168;
  auVar90._16_4_ = auVar94._16_4_ * fVar170;
  auVar90._20_4_ = auVar94._20_4_ * fVar151;
  auVar90._24_4_ = auVar94._24_4_ * fVar172;
  auVar90._28_4_ = auVar96._28_4_;
  auVar94._4_4_ = auVar101._4_4_ * fVar137;
  auVar94._0_4_ = auVar101._0_4_ * fVar205;
  auVar94._8_4_ = auVar101._8_4_ * fVar166;
  auVar94._12_4_ = auVar101._12_4_ * fVar168;
  auVar94._16_4_ = auVar101._16_4_ * fVar170;
  auVar94._20_4_ = auVar101._20_4_ * fVar151;
  auVar94._24_4_ = auVar101._24_4_ * fVar172;
  auVar94._28_4_ = auVar92._28_4_;
  auVar84 = vfmadd231ps_fma(auVar103,auVar102,auVar93);
  auVar80 = vfmadd231ps_fma(auVar90,auVar102,auVar98);
  auVar86 = vfmadd231ps_fma(auVar94,auVar102,auVar100);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar215,auVar95);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar215,auVar97);
  auVar109._8_4_ = 0x7fffffff;
  auVar109._0_8_ = 0x7fffffff7fffffff;
  auVar109._12_4_ = 0x7fffffff;
  auVar109._16_4_ = 0x7fffffff;
  auVar109._20_4_ = 0x7fffffff;
  auVar109._24_4_ = 0x7fffffff;
  auVar109._28_4_ = 0x7fffffff;
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar215,auVar99);
  auVar95 = vandps_avx(ZEXT1632(auVar82),auVar109);
  auVar111._8_4_ = 0x219392ef;
  auVar111._0_8_ = 0x219392ef219392ef;
  auVar111._12_4_ = 0x219392ef;
  auVar111._16_4_ = 0x219392ef;
  auVar111._20_4_ = 0x219392ef;
  auVar111._24_4_ = 0x219392ef;
  auVar111._28_4_ = 0x219392ef;
  uVar68 = vcmpps_avx512vl(auVar95,auVar111,1);
  bVar8 = (bool)((byte)uVar68 & 1);
  auVar91._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar82._0_4_;
  bVar8 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar82._4_4_;
  bVar8 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar82._8_4_;
  bVar8 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar82._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar68 >> 7) * 0x219392ef;
  auVar95 = vandps_avx(ZEXT1632(auVar85),auVar109);
  uVar68 = vcmpps_avx512vl(auVar95,auVar111,1);
  bVar8 = (bool)((byte)uVar68 & 1);
  auVar105._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar85._0_4_;
  bVar8 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar105._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar85._4_4_;
  bVar8 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar105._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar85._8_4_;
  bVar8 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar105._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar85._12_4_;
  auVar105._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * 0x219392ef;
  auVar105._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * 0x219392ef;
  auVar105._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * 0x219392ef;
  auVar105._28_4_ = (uint)(byte)(uVar68 >> 7) * 0x219392ef;
  auVar95 = vandps_avx(ZEXT1632(auVar83),auVar109);
  uVar68 = vcmpps_avx512vl(auVar95,auVar111,1);
  bVar8 = (bool)((byte)uVar68 & 1);
  auVar95._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar83._0_4_;
  bVar8 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar83._4_4_;
  bVar8 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar83._8_4_;
  bVar8 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar83._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar68 >> 7) * 0x219392ef;
  auVar93 = vrcp14ps_avx512vl(auVar91);
  auVar110._8_4_ = 0x3f800000;
  auVar110._0_8_ = 0x3f8000003f800000;
  auVar110._12_4_ = 0x3f800000;
  auVar110._16_4_ = 0x3f800000;
  auVar110._20_4_ = 0x3f800000;
  auVar110._24_4_ = 0x3f800000;
  auVar110._28_4_ = 0x3f800000;
  auVar82 = vfnmadd213ps_fma(auVar91,auVar93,auVar110);
  auVar82 = vfmadd132ps_fma(ZEXT1632(auVar82),auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar105);
  auVar85 = vfnmadd213ps_fma(auVar105,auVar93,auVar110);
  auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar95);
  auVar83 = vfnmadd213ps_fma(auVar95,auVar93,auVar110);
  auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar93,auVar93);
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 7 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar84));
  auVar99._4_4_ = auVar82._4_4_ * auVar95._4_4_;
  auVar99._0_4_ = auVar82._0_4_ * auVar95._0_4_;
  auVar99._8_4_ = auVar82._8_4_ * auVar95._8_4_;
  auVar99._12_4_ = auVar82._12_4_ * auVar95._12_4_;
  auVar99._16_4_ = auVar95._16_4_ * 0.0;
  auVar99._20_4_ = auVar95._20_4_ * 0.0;
  auVar99._24_4_ = auVar95._24_4_ * 0.0;
  auVar99._28_4_ = auVar95._28_4_;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 9 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar84));
  auVar94 = vpbroadcastd_avx512vl();
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar5 * 0x10 + 6));
  auVar108._0_4_ = auVar82._0_4_ * auVar95._0_4_;
  auVar108._4_4_ = auVar82._4_4_ * auVar95._4_4_;
  auVar108._8_4_ = auVar82._8_4_ * auVar95._8_4_;
  auVar108._12_4_ = auVar82._12_4_ * auVar95._12_4_;
  auVar108._16_4_ = auVar95._16_4_ * 0.0;
  auVar108._20_4_ = auVar95._20_4_ * 0.0;
  auVar108._24_4_ = auVar95._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar5 * 0x10 + uVar77 * -2 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar80));
  auVar100._4_4_ = auVar85._4_4_ * auVar95._4_4_;
  auVar100._0_4_ = auVar85._0_4_ * auVar95._0_4_;
  auVar100._8_4_ = auVar85._8_4_ * auVar95._8_4_;
  auVar100._12_4_ = auVar85._12_4_ * auVar95._12_4_;
  auVar100._16_4_ = auVar95._16_4_ * 0.0;
  auVar100._20_4_ = auVar95._20_4_ * 0.0;
  auVar100._24_4_ = auVar95._24_4_ * 0.0;
  auVar100._28_4_ = auVar95._28_4_;
  auVar95 = vcvtdq2ps_avx(auVar93);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar80));
  auVar107._0_4_ = auVar85._0_4_ * auVar95._0_4_;
  auVar107._4_4_ = auVar85._4_4_ * auVar95._4_4_;
  auVar107._8_4_ = auVar85._8_4_ * auVar95._8_4_;
  auVar107._12_4_ = auVar85._12_4_ * auVar95._12_4_;
  auVar107._16_4_ = auVar95._16_4_ * 0.0;
  auVar107._20_4_ = auVar95._20_4_ * 0.0;
  auVar107._24_4_ = auVar95._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 + uVar77 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar86));
  auVar101._4_4_ = auVar95._4_4_ * auVar83._4_4_;
  auVar101._0_4_ = auVar95._0_4_ * auVar83._0_4_;
  auVar101._8_4_ = auVar95._8_4_ * auVar83._8_4_;
  auVar101._12_4_ = auVar95._12_4_ * auVar83._12_4_;
  auVar101._16_4_ = auVar95._16_4_ * 0.0;
  auVar101._20_4_ = auVar95._20_4_ * 0.0;
  auVar101._24_4_ = auVar95._24_4_ * 0.0;
  auVar101._28_4_ = auVar95._28_4_;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0x17 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar86));
  auVar106._0_4_ = auVar83._0_4_ * auVar95._0_4_;
  auVar106._4_4_ = auVar83._4_4_ * auVar95._4_4_;
  auVar106._8_4_ = auVar83._8_4_ * auVar95._8_4_;
  auVar106._12_4_ = auVar83._12_4_ * auVar95._12_4_;
  auVar106._16_4_ = auVar95._16_4_ * 0.0;
  auVar106._20_4_ = auVar95._20_4_ * 0.0;
  auVar106._24_4_ = auVar95._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar95 = vpminsd_avx2(auVar99,auVar108);
  auVar93 = vpminsd_avx2(auVar100,auVar107);
  auVar95 = vmaxps_avx(auVar95,auVar93);
  auVar93 = vpminsd_avx2(auVar101,auVar106);
  uVar138 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar96._4_4_ = uVar138;
  auVar96._0_4_ = uVar138;
  auVar96._8_4_ = uVar138;
  auVar96._12_4_ = uVar138;
  auVar96._16_4_ = uVar138;
  auVar96._20_4_ = uVar138;
  auVar96._24_4_ = uVar138;
  auVar96._28_4_ = uVar138;
  auVar93 = vmaxps_avx512vl(auVar93,auVar96);
  auVar95 = vmaxps_avx(auVar95,auVar93);
  auVar93._8_4_ = 0x3f7ffffa;
  auVar93._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar93._12_4_ = 0x3f7ffffa;
  auVar93._16_4_ = 0x3f7ffffa;
  auVar93._20_4_ = 0x3f7ffffa;
  auVar93._24_4_ = 0x3f7ffffa;
  auVar93._28_4_ = 0x3f7ffffa;
  local_280 = vmulps_avx512vl(auVar95,auVar93);
  auVar95 = vpmaxsd_avx2(auVar99,auVar108);
  auVar93 = vpmaxsd_avx2(auVar100,auVar107);
  auVar95 = vminps_avx(auVar95,auVar93);
  auVar93 = vpmaxsd_avx2(auVar101,auVar106);
  uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar97._4_4_ = uVar138;
  auVar97._0_4_ = uVar138;
  auVar97._8_4_ = uVar138;
  auVar97._12_4_ = uVar138;
  auVar97._16_4_ = uVar138;
  auVar97._20_4_ = uVar138;
  auVar97._24_4_ = uVar138;
  auVar97._28_4_ = uVar138;
  auVar93 = vminps_avx512vl(auVar93,auVar97);
  auVar95 = vminps_avx(auVar95,auVar93);
  auVar98._8_4_ = 0x3f800003;
  auVar98._0_8_ = 0x3f8000033f800003;
  auVar98._12_4_ = 0x3f800003;
  auVar98._16_4_ = 0x3f800003;
  auVar98._20_4_ = 0x3f800003;
  auVar98._24_4_ = 0x3f800003;
  auVar98._28_4_ = 0x3f800003;
  auVar95 = vmulps_avx512vl(auVar95,auVar98);
  uVar18 = vpcmpgtd_avx512vl(auVar94,_DAT_01fe9900);
  uVar16 = vcmpps_avx512vl(local_280,auVar95,2);
  if ((byte)((byte)uVar16 & (byte)uVar18) == 0) {
    return;
  }
  local_608 = (ulong)(byte)((byte)uVar16 & (byte)uVar18);
  local_490 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_610 = prim;
LAB_01d452e8:
  lVar72 = 0;
  for (uVar68 = local_608; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    lVar72 = lVar72 + 1;
  }
  uVar71 = *(uint *)(prim + 2);
  local_9b8 = (ulong)*(uint *)(prim + lVar72 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar71].ptr;
  uVar68 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_9b8);
  p_Var7 = pGVar6[1].intersectionFilterN;
  lVar72 = *(long *)&pGVar6[1].time_range.upper;
  auVar82 = *(undefined1 (*) [16])(lVar72 + (long)p_Var7 * uVar68);
  auVar85 = *(undefined1 (*) [16])(lVar72 + (uVar68 + 1) * (long)p_Var7);
  auVar83 = *(undefined1 (*) [16])(lVar72 + (uVar68 + 2) * (long)p_Var7);
  local_608 = local_608 - 1 & local_608;
  auVar84 = *(undefined1 (*) [16])(lVar72 + (uVar68 + 3) * (long)p_Var7);
  if (local_608 != 0) {
    uVar70 = local_608 - 1 & local_608;
    for (uVar68 = local_608; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    }
    if (uVar70 != 0) {
      for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar86 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_3a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  local_3c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar80 = vunpcklps_avx512vl(local_3a0._0_16_,local_3c0._0_16_);
  local_700 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar251 = ZEXT3264(local_700);
  auVar250 = local_700._0_16_;
  local_710 = vinsertps_avx512f(auVar80,auVar250,0x28);
  auVar89._0_4_ = auVar82._0_4_ + auVar85._0_4_ + auVar83._0_4_ + auVar84._0_4_;
  auVar89._4_4_ = auVar82._4_4_ + auVar85._4_4_ + auVar83._4_4_ + auVar84._4_4_;
  auVar89._8_4_ = auVar82._8_4_ + auVar85._8_4_ + auVar83._8_4_ + auVar84._8_4_;
  auVar89._12_4_ = auVar82._12_4_ + auVar85._12_4_ + auVar83._12_4_ + auVar84._12_4_;
  auVar88._8_4_ = 0x3e800000;
  auVar88._0_8_ = 0x3e8000003e800000;
  auVar88._12_4_ = 0x3e800000;
  auVar80 = vmulps_avx512vl(auVar89,auVar88);
  auVar80 = vsubps_avx(auVar80,auVar86);
  auVar80 = vdpps_avx(auVar80,local_710,0x7f);
  fVar205 = *(float *)(ray + k * 4 + 0x30);
  local_720 = vdpps_avx(local_710,local_710,0x7f);
  auVar222._4_12_ = ZEXT812(0) << 0x20;
  auVar222._0_4_ = local_720._0_4_;
  auVar81 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar222);
  auVar87 = vfnmadd213ss_fma(auVar81,local_720,ZEXT416(0x40000000));
  local_260 = auVar80._0_4_ * auVar81._0_4_ * auVar87._0_4_;
  auVar223._4_4_ = local_260;
  auVar223._0_4_ = local_260;
  auVar223._8_4_ = local_260;
  auVar223._12_4_ = local_260;
  fStack_6b0 = local_260;
  _local_6c0 = auVar223;
  fStack_6ac = local_260;
  fStack_6a8 = local_260;
  fStack_6a4 = local_260;
  auVar80 = vfmadd231ps_fma(auVar86,local_710,auVar223);
  auVar80 = vblendps_avx(auVar80,ZEXT816(0) << 0x40,8);
  auVar82 = vsubps_avx(auVar82,auVar80);
  auVar83 = vsubps_avx(auVar83,auVar80);
  auVar85 = vsubps_avx(auVar85,auVar80);
  auVar84 = vsubps_avx(auVar84,auVar80);
  uVar138 = auVar82._0_4_;
  local_8a0._4_4_ = uVar138;
  local_8a0._0_4_ = uVar138;
  local_8a0._8_4_ = uVar138;
  local_8a0._12_4_ = uVar138;
  local_8a0._16_4_ = uVar138;
  local_8a0._20_4_ = uVar138;
  local_8a0._24_4_ = uVar138;
  local_8a0._28_4_ = uVar138;
  auVar234 = ZEXT3264(local_8a0);
  auVar117._8_4_ = 1;
  auVar117._0_8_ = 0x100000001;
  auVar117._12_4_ = 1;
  auVar117._16_4_ = 1;
  auVar117._20_4_ = 1;
  auVar117._24_4_ = 1;
  auVar117._28_4_ = 1;
  local_580 = ZEXT1632(auVar82);
  local_8c0 = vpermps_avx512vl(auVar117,local_580);
  auVar255 = ZEXT3264(local_8c0);
  auVar118._8_4_ = 2;
  auVar118._0_8_ = 0x200000002;
  auVar118._12_4_ = 2;
  auVar118._16_4_ = 2;
  auVar118._20_4_ = 2;
  auVar118._24_4_ = 2;
  auVar118._28_4_ = 2;
  local_7c0 = vpermps_avx2(auVar118,local_580);
  auVar240 = ZEXT3264(local_7c0);
  auVar197._8_4_ = 3;
  auVar197._0_8_ = 0x300000003;
  auVar197._12_4_ = 3;
  auVar197._16_4_ = 3;
  auVar197._20_4_ = 3;
  auVar197._24_4_ = 3;
  auVar197._28_4_ = 3;
  local_7e0 = vpermps_avx2(auVar197,local_580);
  auVar241 = ZEXT3264(local_7e0);
  uVar138 = auVar85._0_4_;
  local_560._4_4_ = uVar138;
  local_560._0_4_ = uVar138;
  local_560._8_4_ = uVar138;
  local_560._12_4_ = uVar138;
  local_560._16_4_ = uVar138;
  local_560._20_4_ = uVar138;
  local_560._24_4_ = uVar138;
  local_560._28_4_ = uVar138;
  auVar230 = ZEXT3264(local_560);
  local_5c0 = ZEXT1632(auVar85);
  local_6e0 = vpermps_avx2(auVar117,local_5c0);
  auVar216 = ZEXT3264(local_6e0);
  local_8e0 = vpermps_avx512vl(auVar118,local_5c0);
  auVar242 = ZEXT3264(local_8e0);
  local_900 = vpermps_avx512vl(auVar197,local_5c0);
  auVar243 = ZEXT3264(local_900);
  local_920 = vbroadcastss_avx512vl(auVar83);
  auVar244 = ZEXT3264(local_920);
  local_5a0 = ZEXT1632(auVar83);
  local_800 = vpermps_avx512vl(auVar117,local_5a0);
  auVar245 = ZEXT3264(local_800);
  local_940 = vpermps_avx512vl(auVar118,local_5a0);
  auVar246 = ZEXT3264(local_940);
  local_820 = vpermps_avx512vl(auVar197,local_5a0);
  auVar247 = ZEXT3264(local_820);
  local_960 = vbroadcastss_avx512vl(auVar84);
  auVar248 = ZEXT3264(local_960);
  _local_5e0 = ZEXT1632(auVar84);
  local_840 = vpermps_avx512vl(auVar117,_local_5e0);
  auVar249 = ZEXT3264(local_840);
  local_980 = vpermps_avx512vl(auVar118,_local_5e0);
  auVar252 = ZEXT3264(local_980);
  local_9a0 = vpermps_avx512vl(auVar197,_local_5e0);
  auVar253 = ZEXT3264(local_9a0);
  auVar82 = vmulss_avx512f(auVar250,auVar250);
  auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),local_3c0,local_3c0);
  local_240 = vfmadd231ps_avx512vl(auVar95,local_3a0,local_3a0);
  uVar138 = local_240._0_4_;
  local_220._4_4_ = uVar138;
  local_220._0_4_ = uVar138;
  local_220._8_4_ = uVar138;
  local_220._12_4_ = uVar138;
  local_220._16_4_ = uVar138;
  local_220._20_4_ = uVar138;
  local_220._24_4_ = uVar138;
  local_220._28_4_ = uVar138;
  auVar114._8_4_ = 0x7fffffff;
  auVar114._0_8_ = 0x7fffffff7fffffff;
  auVar114._12_4_ = 0x7fffffff;
  auVar114._16_4_ = 0x7fffffff;
  auVar114._20_4_ = 0x7fffffff;
  auVar114._24_4_ = 0x7fffffff;
  auVar114._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar114);
  local_660 = ZEXT416((uint)local_260);
  local_260 = fVar205 - local_260;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_470 = vpbroadcastd_avx512vl();
  iVar69 = 1;
  uVar68 = 0;
  local_480 = vpbroadcastd_avx512vl();
  auVar82 = vsqrtss_avx(local_720,local_720);
  local_9a4 = auVar82._0_4_;
  auVar82 = vsqrtss_avx(local_720,local_720);
  local_9a8 = auVar82._0_4_;
  local_330 = ZEXT816(0x3f80000000000000);
  auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar254 = ZEXT3264(auVar95);
  do {
    auVar82 = vmovshdup_avx(local_330);
    auVar82 = vsubps_avx(auVar82,local_330);
    fVar137 = auVar82._0_4_;
    fVar151 = fVar137 * 0.04761905;
    auVar208._0_4_ = local_330._0_4_;
    auVar208._4_4_ = auVar208._0_4_;
    auVar208._8_4_ = auVar208._0_4_;
    auVar208._12_4_ = auVar208._0_4_;
    auVar208._16_4_ = auVar208._0_4_;
    auVar208._20_4_ = auVar208._0_4_;
    auVar208._24_4_ = auVar208._0_4_;
    auVar208._28_4_ = auVar208._0_4_;
    local_740._4_4_ = fVar137;
    local_740._0_4_ = fVar137;
    local_740._8_4_ = fVar137;
    local_740._12_4_ = fVar137;
    local_740._16_4_ = fVar137;
    local_740._20_4_ = fVar137;
    local_740._24_4_ = fVar137;
    local_740._28_4_ = fVar137;
    auVar82 = vfmadd231ps_fma(auVar208,local_740,_DAT_01faff20);
    auVar113 = auVar254._0_32_;
    auVar95 = vsubps_avx512vl(auVar113,ZEXT1632(auVar82));
    fVar137 = auVar82._0_4_;
    fVar166 = auVar82._4_4_;
    auVar64._4_4_ = auVar230._4_4_ * fVar166;
    auVar64._0_4_ = auVar230._0_4_ * fVar137;
    fVar168 = auVar82._8_4_;
    auVar64._8_4_ = auVar230._8_4_ * fVar168;
    fVar170 = auVar82._12_4_;
    auVar64._12_4_ = auVar230._12_4_ * fVar170;
    auVar64._16_4_ = auVar230._16_4_ * 0.0;
    auVar64._20_4_ = auVar230._20_4_ * 0.0;
    auVar64._24_4_ = auVar230._24_4_ * 0.0;
    auVar64._28_4_ = DAT_01faff20._28_4_;
    auVar98 = ZEXT1632(auVar82);
    auVar42._4_4_ = auVar216._4_4_ * fVar166;
    auVar42._0_4_ = auVar216._0_4_ * fVar137;
    auVar42._8_4_ = auVar216._8_4_ * fVar168;
    auVar42._12_4_ = auVar216._12_4_ * fVar170;
    auVar42._16_4_ = auVar216._16_4_ * 0.0;
    auVar42._20_4_ = auVar216._20_4_ * 0.0;
    auVar42._24_4_ = auVar216._24_4_ * 0.0;
    auVar42._28_4_ = auVar208._0_4_;
    auVar93 = vmulps_avx512vl(auVar242._0_32_,auVar98);
    auVar96 = vmulps_avx512vl(auVar243._0_32_,auVar98);
    auVar85 = vfmadd231ps_fma(auVar64,auVar95,auVar234._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar42,auVar95,auVar255._0_32_);
    auVar83 = vfmadd231ps_fma(auVar93,auVar95,auVar240._0_32_);
    auVar84 = vfmadd231ps_fma(auVar96,auVar95,auVar241._0_32_);
    auVar93 = vmulps_avx512vl(auVar244._0_32_,auVar98);
    auVar101 = ZEXT1632(auVar82);
    auVar96 = vmulps_avx512vl(auVar245._0_32_,auVar101);
    auVar98 = vmulps_avx512vl(auVar246._0_32_,auVar101);
    auVar94 = vmulps_avx512vl(auVar247._0_32_,auVar101);
    auVar80 = vfmadd231ps_fma(auVar93,auVar95,auVar230._0_32_);
    auVar86 = vfmadd231ps_fma(auVar96,auVar95,auVar216._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar98,auVar95,auVar242._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar94,auVar95,auVar243._0_32_);
    auVar98 = vmulps_avx512vl(auVar248._0_32_,auVar101);
    auVar94 = vmulps_avx512vl(auVar249._0_32_,auVar101);
    auVar99 = vmulps_avx512vl(auVar252._0_32_,auVar101);
    auVar100 = vmulps_avx512vl(auVar253._0_32_,auVar101);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,auVar244._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar95,auVar245._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar95,auVar246._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar95,auVar247._0_32_);
    auVar43._28_4_ = auVar216._28_4_;
    auVar43._0_28_ =
         ZEXT1628(CONCAT412(fVar170 * auVar80._12_4_,
                            CONCAT48(fVar168 * auVar80._8_4_,
                                     CONCAT44(fVar166 * auVar80._4_4_,fVar137 * auVar80._0_4_))));
    auVar101 = vmulps_avx512vl(auVar101,ZEXT1632(auVar86));
    auVar102 = vmulps_avx512vl(ZEXT1632(auVar82),auVar93);
    auVar92 = vmulps_avx512vl(ZEXT1632(auVar82),auVar96);
    auVar82 = vfmadd231ps_fma(auVar43,auVar95,ZEXT1632(auVar85));
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar95,auVar97);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar95,ZEXT1632(auVar83));
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar95,ZEXT1632(auVar84));
    auVar228._0_4_ = auVar98._0_4_ * fVar137;
    auVar228._4_4_ = auVar98._4_4_ * fVar166;
    auVar228._8_4_ = auVar98._8_4_ * fVar168;
    auVar228._12_4_ = auVar98._12_4_ * fVar170;
    auVar228._16_4_ = auVar98._16_4_ * 0.0;
    auVar228._20_4_ = auVar98._20_4_ * 0.0;
    auVar228._24_4_ = auVar98._24_4_ * 0.0;
    auVar228._28_4_ = 0;
    auVar44._4_4_ = auVar94._4_4_ * fVar166;
    auVar44._0_4_ = auVar94._0_4_ * fVar137;
    auVar44._8_4_ = auVar94._8_4_ * fVar168;
    auVar44._12_4_ = auVar94._12_4_ * fVar170;
    auVar44._16_4_ = auVar94._16_4_ * 0.0;
    auVar44._20_4_ = auVar94._20_4_ * 0.0;
    auVar44._24_4_ = auVar94._24_4_ * 0.0;
    auVar44._28_4_ = auVar98._28_4_;
    auVar45._4_4_ = auVar99._4_4_ * fVar166;
    auVar45._0_4_ = auVar99._0_4_ * fVar137;
    auVar45._8_4_ = auVar99._8_4_ * fVar168;
    auVar45._12_4_ = auVar99._12_4_ * fVar170;
    auVar45._16_4_ = auVar99._16_4_ * 0.0;
    auVar45._20_4_ = auVar99._20_4_ * 0.0;
    auVar45._24_4_ = auVar99._24_4_ * 0.0;
    auVar45._28_4_ = auVar94._28_4_;
    auVar46._4_4_ = auVar100._4_4_ * fVar166;
    auVar46._0_4_ = auVar100._0_4_ * fVar137;
    auVar46._8_4_ = auVar100._8_4_ * fVar168;
    auVar46._12_4_ = auVar100._12_4_ * fVar170;
    auVar46._16_4_ = auVar100._16_4_ * 0.0;
    auVar46._20_4_ = auVar100._20_4_ * 0.0;
    auVar46._24_4_ = auVar100._24_4_ * 0.0;
    auVar46._28_4_ = auVar99._28_4_;
    auVar85 = vfmadd231ps_fma(auVar228,auVar95,ZEXT1632(auVar80));
    auVar83 = vfmadd231ps_fma(auVar44,auVar95,ZEXT1632(auVar86));
    auVar84 = vfmadd231ps_fma(auVar45,auVar95,auVar93);
    auVar80 = vfmadd231ps_fma(auVar46,auVar95,auVar96);
    auVar47._28_4_ = auVar97._28_4_;
    auVar47._0_28_ =
         ZEXT1628(CONCAT412(auVar83._12_4_ * fVar170,
                            CONCAT48(auVar83._8_4_ * fVar168,
                                     CONCAT44(auVar83._4_4_ * fVar166,auVar83._0_4_ * fVar137))));
    auVar86 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar170 * auVar85._12_4_,
                                                 CONCAT48(fVar168 * auVar85._8_4_,
                                                          CONCAT44(fVar166 * auVar85._4_4_,
                                                                   fVar137 * auVar85._0_4_)))),
                              auVar95,ZEXT1632(auVar82));
    auVar94 = vfmadd231ps_avx512vl(auVar47,auVar95,auVar101);
    auVar99 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar84._12_4_ * fVar170,
                                            CONCAT48(auVar84._8_4_ * fVar168,
                                                     CONCAT44(auVar84._4_4_ * fVar166,
                                                              auVar84._0_4_ * fVar137)))),auVar95,
                         auVar102);
    auVar93 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar80._12_4_ * fVar170,
                                            CONCAT48(auVar80._8_4_ * fVar168,
                                                     CONCAT44(auVar80._4_4_ * fVar166,
                                                              auVar80._0_4_ * fVar137)))),auVar92,
                         auVar95);
    auVar95 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar82));
    auVar96 = vsubps_avx512vl(ZEXT1632(auVar83),auVar101);
    auVar97 = vsubps_avx512vl(ZEXT1632(auVar84),auVar102);
    auVar98 = vsubps_avx512vl(ZEXT1632(auVar80),auVar92);
    auVar238._0_4_ = fVar151 * auVar95._0_4_ * 3.0;
    auVar238._4_4_ = fVar151 * auVar95._4_4_ * 3.0;
    auVar238._8_4_ = fVar151 * auVar95._8_4_ * 3.0;
    auVar238._12_4_ = fVar151 * auVar95._12_4_ * 3.0;
    auVar238._16_4_ = fVar151 * auVar95._16_4_ * 3.0;
    auVar238._20_4_ = fVar151 * auVar95._20_4_ * 3.0;
    auVar238._24_4_ = fVar151 * auVar95._24_4_ * 3.0;
    auVar238._28_4_ = 0;
    auVar239._0_4_ = fVar151 * auVar96._0_4_ * 3.0;
    auVar239._4_4_ = fVar151 * auVar96._4_4_ * 3.0;
    auVar239._8_4_ = fVar151 * auVar96._8_4_ * 3.0;
    auVar239._12_4_ = fVar151 * auVar96._12_4_ * 3.0;
    auVar239._16_4_ = fVar151 * auVar96._16_4_ * 3.0;
    auVar239._20_4_ = fVar151 * auVar96._20_4_ * 3.0;
    auVar239._24_4_ = fVar151 * auVar96._24_4_ * 3.0;
    auVar239._28_4_ = 0;
    auVar48._4_4_ = fVar151 * auVar97._4_4_ * 3.0;
    auVar48._0_4_ = fVar151 * auVar97._0_4_ * 3.0;
    auVar48._8_4_ = fVar151 * auVar97._8_4_ * 3.0;
    auVar48._12_4_ = fVar151 * auVar97._12_4_ * 3.0;
    auVar48._16_4_ = fVar151 * auVar97._16_4_ * 3.0;
    auVar48._20_4_ = fVar151 * auVar97._20_4_ * 3.0;
    auVar48._24_4_ = fVar151 * auVar97._24_4_ * 3.0;
    auVar48._28_4_ = auVar100._28_4_;
    fVar137 = auVar98._0_4_ * 3.0 * fVar151;
    fVar166 = auVar98._4_4_ * 3.0 * fVar151;
    auVar49._4_4_ = fVar166;
    auVar49._0_4_ = fVar137;
    fVar168 = auVar98._8_4_ * 3.0 * fVar151;
    auVar49._8_4_ = fVar168;
    fVar170 = auVar98._12_4_ * 3.0 * fVar151;
    auVar49._12_4_ = fVar170;
    fVar172 = auVar98._16_4_ * 3.0 * fVar151;
    auVar49._16_4_ = fVar172;
    fVar174 = auVar98._20_4_ * 3.0 * fVar151;
    auVar49._20_4_ = fVar174;
    fVar204 = auVar98._24_4_ * 3.0 * fVar151;
    auVar49._24_4_ = fVar204;
    auVar49._28_4_ = fVar151;
    auVar82 = vxorps_avx512vl(auVar255._0_16_,auVar255._0_16_);
    auVar100 = vpermt2ps_avx512vl(ZEXT1632(auVar86),_DAT_01feed00,ZEXT1632(auVar82));
    auVar101 = vpermt2ps_avx512vl(auVar94,_DAT_01feed00,ZEXT1632(auVar82));
    auVar96 = ZEXT1632(auVar82);
    auVar102 = vpermt2ps_avx512vl(auVar99,_DAT_01feed00,auVar96);
    auVar221._0_4_ = auVar93._0_4_ + fVar137;
    auVar221._4_4_ = auVar93._4_4_ + fVar166;
    auVar221._8_4_ = auVar93._8_4_ + fVar168;
    auVar221._12_4_ = auVar93._12_4_ + fVar170;
    auVar221._16_4_ = auVar93._16_4_ + fVar172;
    auVar221._20_4_ = auVar93._20_4_ + fVar174;
    auVar221._24_4_ = auVar93._24_4_ + fVar204;
    auVar221._28_4_ = auVar93._28_4_ + fVar151;
    auVar95 = vmaxps_avx(auVar93,auVar221);
    auVar92 = vminps_avx512vl(auVar93,auVar221);
    auVar103 = vpermt2ps_avx512vl(auVar93,_DAT_01feed00,auVar96);
    auVar104 = vpermt2ps_avx512vl(auVar238,_DAT_01feed00,auVar96);
    auVar90 = vpermt2ps_avx512vl(auVar239,_DAT_01feed00,auVar96);
    auVar114 = ZEXT1632(auVar82);
    auVar91 = vpermt2ps_avx512vl(auVar48,_DAT_01feed00,auVar114);
    auVar93 = vpermt2ps_avx512vl(auVar49,_DAT_01feed00,auVar114);
    auVar93 = vsubps_avx(auVar103,auVar93);
    auVar96 = vsubps_avx(auVar100,ZEXT1632(auVar86));
    auVar97 = vsubps_avx(auVar101,auVar94);
    auVar98 = vsubps_avx(auVar102,auVar99);
    auVar105 = vmulps_avx512vl(auVar97,auVar48);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar239,auVar98);
    auVar106 = vmulps_avx512vl(auVar98,auVar238);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar48,auVar96);
    auVar107 = vmulps_avx512vl(auVar96,auVar239);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar238,auVar97);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar106 = vmulps_avx512vl(auVar98,auVar98);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar97,auVar97);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar96,auVar96);
    auVar107 = vrcp14ps_avx512vl(auVar106);
    auVar108 = vfnmadd213ps_avx512vl(auVar107,auVar106,auVar113);
    auVar107 = vfmadd132ps_avx512vl(auVar108,auVar107,auVar107);
    auVar105 = vmulps_avx512vl(auVar105,auVar107);
    auVar108 = vmulps_avx512vl(auVar97,auVar91);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar90,auVar98);
    auVar109 = vmulps_avx512vl(auVar98,auVar104);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar91,auVar96);
    auVar110 = vmulps_avx512vl(auVar96,auVar90);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar104,auVar97);
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar107 = vmulps_avx512vl(auVar108,auVar107);
    auVar105 = vmaxps_avx512vl(auVar105,auVar107);
    auVar105 = vsqrtps_avx512vl(auVar105);
    auVar107 = vmaxps_avx512vl(auVar93,auVar103);
    auVar95 = vmaxps_avx512vl(auVar95,auVar107);
    auVar107 = vaddps_avx512vl(auVar105,auVar95);
    auVar95 = vminps_avx(auVar93,auVar103);
    auVar95 = vminps_avx512vl(auVar92,auVar95);
    auVar95 = vsubps_avx512vl(auVar95,auVar105);
    auVar30._8_4_ = 0x3f800002;
    auVar30._0_8_ = 0x3f8000023f800002;
    auVar30._12_4_ = 0x3f800002;
    auVar30._16_4_ = 0x3f800002;
    auVar30._20_4_ = 0x3f800002;
    auVar30._24_4_ = 0x3f800002;
    auVar30._28_4_ = 0x3f800002;
    auVar93 = vmulps_avx512vl(auVar107,auVar30);
    auVar31._8_4_ = 0x3f7ffffc;
    auVar31._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar31._12_4_ = 0x3f7ffffc;
    auVar31._16_4_ = 0x3f7ffffc;
    auVar31._20_4_ = 0x3f7ffffc;
    auVar31._24_4_ = 0x3f7ffffc;
    auVar31._28_4_ = 0x3f7ffffc;
    local_780 = vmulps_avx512vl(auVar95,auVar31);
    auVar95 = vmulps_avx512vl(auVar93,auVar93);
    auVar93 = vrsqrt14ps_avx512vl(auVar106);
    auVar32._8_4_ = 0xbf000000;
    auVar32._0_8_ = 0xbf000000bf000000;
    auVar32._12_4_ = 0xbf000000;
    auVar32._16_4_ = 0xbf000000;
    auVar32._20_4_ = 0xbf000000;
    auVar32._24_4_ = 0xbf000000;
    auVar32._28_4_ = 0xbf000000;
    auVar92 = vmulps_avx512vl(auVar106,auVar32);
    fVar137 = auVar93._0_4_;
    fVar166 = auVar93._4_4_;
    fVar168 = auVar93._8_4_;
    fVar170 = auVar93._12_4_;
    fVar151 = auVar93._16_4_;
    fVar172 = auVar93._20_4_;
    fVar174 = auVar93._24_4_;
    auVar50._4_4_ = fVar166 * fVar166 * fVar166 * auVar92._4_4_;
    auVar50._0_4_ = fVar137 * fVar137 * fVar137 * auVar92._0_4_;
    auVar50._8_4_ = fVar168 * fVar168 * fVar168 * auVar92._8_4_;
    auVar50._12_4_ = fVar170 * fVar170 * fVar170 * auVar92._12_4_;
    auVar50._16_4_ = fVar151 * fVar151 * fVar151 * auVar92._16_4_;
    auVar50._20_4_ = fVar172 * fVar172 * fVar172 * auVar92._20_4_;
    auVar50._24_4_ = fVar174 * fVar174 * fVar174 * auVar92._24_4_;
    auVar50._28_4_ = auVar107._28_4_;
    auVar33._8_4_ = 0x3fc00000;
    auVar33._0_8_ = 0x3fc000003fc00000;
    auVar33._12_4_ = 0x3fc00000;
    auVar33._16_4_ = 0x3fc00000;
    auVar33._20_4_ = 0x3fc00000;
    auVar33._24_4_ = 0x3fc00000;
    auVar33._28_4_ = 0x3fc00000;
    auVar93 = vfmadd231ps_avx512vl(auVar50,auVar93,auVar33);
    auVar92 = vmulps_avx512vl(auVar96,auVar93);
    auVar103 = vmulps_avx512vl(auVar97,auVar93);
    auVar105 = vmulps_avx512vl(auVar98,auVar93);
    auVar215 = ZEXT1632(auVar86);
    auVar106 = vsubps_avx512vl(auVar114,auVar215);
    auVar107 = vsubps_avx512vl(auVar114,auVar94);
    auVar108 = vsubps_avx512vl(auVar114,auVar99);
    auVar109 = vmulps_avx512vl(auVar251._0_32_,auVar108);
    auVar109 = vfmadd231ps_avx512vl(auVar109,local_3c0,auVar107);
    auVar109 = vfmadd231ps_avx512vl(auVar109,local_3a0,auVar106);
    auVar110 = vmulps_avx512vl(auVar108,auVar108);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar107,auVar107);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar106,auVar106);
    auVar111 = vmulps_avx512vl(auVar251._0_32_,auVar105);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar103,local_3c0);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar92,local_3a0);
    auVar105 = vmulps_avx512vl(auVar108,auVar105);
    auVar103 = vfmadd231ps_avx512vl(auVar105,auVar107,auVar103);
    auVar92 = vfmadd231ps_avx512vl(auVar103,auVar106,auVar92);
    auVar103 = vmulps_avx512vl(auVar111,auVar111);
    auVar105 = vsubps_avx512vl(local_220,auVar103);
    auVar112 = vmulps_avx512vl(auVar111,auVar92);
    auVar109 = vsubps_avx512vl(auVar109,auVar112);
    auVar109 = vaddps_avx512vl(auVar109,auVar109);
    auVar112 = vmulps_avx512vl(auVar92,auVar92);
    local_7a0 = vsubps_avx512vl(auVar110,auVar112);
    auVar95 = vsubps_avx512vl(local_7a0,auVar95);
    local_680 = vmulps_avx512vl(auVar109,auVar109);
    auVar34._8_4_ = 0x40800000;
    auVar34._0_8_ = 0x4080000040800000;
    auVar34._12_4_ = 0x40800000;
    auVar34._16_4_ = 0x40800000;
    auVar34._20_4_ = 0x40800000;
    auVar34._24_4_ = 0x40800000;
    auVar34._28_4_ = 0x40800000;
    _local_4c0 = vmulps_avx512vl(auVar105,auVar34);
    auVar110 = vmulps_avx512vl(_local_4c0,auVar95);
    auVar110 = vsubps_avx512vl(local_680,auVar110);
    uVar70 = vcmpps_avx512vl(auVar110,auVar114,5);
    bVar65 = (byte)uVar70;
    fVar137 = (float)local_6c0._0_4_;
    fVar166 = (float)local_6c0._4_4_;
    fVar168 = fStack_6b8;
    fVar170 = fStack_6b4;
    fVar151 = fStack_6b0;
    fVar172 = fStack_6ac;
    fVar174 = fStack_6a8;
    fVar204 = fStack_6a4;
    if (bVar65 == 0) {
LAB_01d45f84:
      auVar251 = ZEXT3264(local_700);
      auVar234 = ZEXT3264(local_8a0);
      auVar255 = ZEXT3264(local_8c0);
      auVar240 = ZEXT3264(local_7c0);
      auVar241 = ZEXT3264(local_7e0);
      auVar230 = ZEXT3264(local_560);
      auVar216 = ZEXT3264(local_6e0);
      auVar242 = ZEXT3264(local_8e0);
      auVar243 = ZEXT3264(local_900);
      auVar244 = ZEXT3264(local_920);
      auVar245 = ZEXT3264(local_800);
      auVar246 = ZEXT3264(local_940);
      auVar247 = ZEXT3264(local_820);
      auVar248 = ZEXT3264(local_960);
      auVar249 = ZEXT3264(local_840);
      auVar252 = ZEXT3264(local_980);
      auVar253 = ZEXT3264(local_9a0);
    }
    else {
      auVar110 = vsqrtps_avx512vl(auVar110);
      auVar112 = vaddps_avx512vl(auVar105,auVar105);
      local_540 = vrcp14ps_avx512vl(auVar112);
      auVar113 = vfnmadd213ps_avx512vl(local_540,auVar112,auVar113);
      auVar113 = vfmadd132ps_avx512vl(auVar113,local_540,local_540);
      auVar35._8_4_ = 0x80000000;
      auVar35._0_8_ = 0x8000000080000000;
      auVar35._12_4_ = 0x80000000;
      auVar35._16_4_ = 0x80000000;
      auVar35._20_4_ = 0x80000000;
      auVar35._24_4_ = 0x80000000;
      auVar35._28_4_ = 0x80000000;
      local_6a0 = vxorps_avx512vl(auVar109,auVar35);
      auVar114 = vsubps_avx512vl(local_6a0,auVar110);
      local_4e0 = vmulps_avx512vl(auVar114,auVar113);
      auVar110 = vsubps_avx512vl(auVar110,auVar109);
      local_760 = vmulps_avx512vl(auVar110,auVar113);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar113 = vblendmps_avx512vl(auVar110,local_4e0);
      auVar115._0_4_ =
           (uint)(bVar65 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar110._0_4_;
      bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar8 * auVar113._4_4_ | (uint)!bVar8 * auVar110._4_4_;
      bVar8 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar8 * auVar113._8_4_ | (uint)!bVar8 * auVar110._8_4_;
      bVar8 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar8 * auVar113._12_4_ | (uint)!bVar8 * auVar110._12_4_;
      bVar8 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar115._16_4_ = (uint)bVar8 * auVar113._16_4_ | (uint)!bVar8 * auVar110._16_4_;
      bVar8 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar115._20_4_ = (uint)bVar8 * auVar113._20_4_ | (uint)!bVar8 * auVar110._20_4_;
      bVar8 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar115._24_4_ = (uint)bVar8 * auVar113._24_4_ | (uint)!bVar8 * auVar110._24_4_;
      bVar8 = SUB81(uVar70 >> 7,0);
      auVar115._28_4_ = (uint)bVar8 * auVar113._28_4_ | (uint)!bVar8 * auVar110._28_4_;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar113 = vblendmps_avx512vl(auVar110,local_760);
      auVar116._0_4_ =
           (uint)(bVar65 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar110._0_4_;
      bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar8 * auVar113._4_4_ | (uint)!bVar8 * auVar110._4_4_;
      bVar8 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar8 * auVar113._8_4_ | (uint)!bVar8 * auVar110._8_4_;
      bVar8 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar8 * auVar113._12_4_ | (uint)!bVar8 * auVar110._12_4_;
      bVar8 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar8 * auVar113._16_4_ | (uint)!bVar8 * auVar110._16_4_;
      bVar8 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar8 * auVar113._20_4_ | (uint)!bVar8 * auVar110._20_4_;
      bVar8 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar8 * auVar113._24_4_ | (uint)!bVar8 * auVar110._24_4_;
      bVar8 = SUB81(uVar70 >> 7,0);
      auVar116._28_4_ = (uint)bVar8 * auVar113._28_4_ | (uint)!bVar8 * auVar110._28_4_;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar103,auVar110);
      local_500 = vmaxps_avx512vl(local_240,auVar110);
      auVar36._8_4_ = 0x36000000;
      auVar36._0_8_ = 0x3600000036000000;
      auVar36._12_4_ = 0x36000000;
      auVar36._16_4_ = 0x36000000;
      auVar36._20_4_ = 0x36000000;
      auVar36._24_4_ = 0x36000000;
      auVar36._28_4_ = 0x36000000;
      local_520 = vmulps_avx512vl(local_500,auVar36);
      vandps_avx512vl(auVar105,auVar110);
      uVar77 = vcmpps_avx512vl(local_520,local_520,1);
      uVar70 = uVar70 & uVar77;
      bVar67 = (byte)uVar70;
      if (bVar67 != 0) {
        uVar77 = vcmpps_avx512vl(auVar95,_DAT_01faff00,2);
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar105 = vblendmps_avx512vl(auVar95,auVar103);
        bVar73 = (byte)uVar77;
        uVar79 = (uint)(bVar73 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar73 & 1) * local_520._0_4_;
        bVar8 = (bool)((byte)(uVar77 >> 1) & 1);
        uVar78 = (uint)bVar8 * auVar105._4_4_ | (uint)!bVar8 * local_520._4_4_;
        bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
        uVar130 = (uint)bVar8 * auVar105._8_4_ | (uint)!bVar8 * local_520._8_4_;
        bVar8 = (bool)((byte)(uVar77 >> 3) & 1);
        uVar131 = (uint)bVar8 * auVar105._12_4_ | (uint)!bVar8 * local_520._12_4_;
        bVar8 = (bool)((byte)(uVar77 >> 4) & 1);
        uVar132 = (uint)bVar8 * auVar105._16_4_ | (uint)!bVar8 * local_520._16_4_;
        bVar8 = (bool)((byte)(uVar77 >> 5) & 1);
        uVar133 = (uint)bVar8 * auVar105._20_4_ | (uint)!bVar8 * local_520._20_4_;
        bVar8 = (bool)((byte)(uVar77 >> 6) & 1);
        uVar134 = (uint)bVar8 * auVar105._24_4_ | (uint)!bVar8 * local_520._24_4_;
        bVar8 = SUB81(uVar77 >> 7,0);
        uVar135 = (uint)bVar8 * auVar105._28_4_ | (uint)!bVar8 * local_520._28_4_;
        auVar115._0_4_ = (bVar67 & 1) * uVar79 | !(bool)(bVar67 & 1) * auVar115._0_4_;
        bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar115._4_4_ = bVar8 * uVar78 | !bVar8 * auVar115._4_4_;
        bVar8 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar115._8_4_ = bVar8 * uVar130 | !bVar8 * auVar115._8_4_;
        bVar8 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar115._12_4_ = bVar8 * uVar131 | !bVar8 * auVar115._12_4_;
        bVar8 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar115._16_4_ = bVar8 * uVar132 | !bVar8 * auVar115._16_4_;
        bVar8 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar115._20_4_ = bVar8 * uVar133 | !bVar8 * auVar115._20_4_;
        bVar8 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar115._24_4_ = bVar8 * uVar134 | !bVar8 * auVar115._24_4_;
        bVar8 = SUB81(uVar70 >> 7,0);
        auVar115._28_4_ = bVar8 * uVar135 | !bVar8 * auVar115._28_4_;
        auVar95 = vblendmps_avx512vl(auVar103,auVar95);
        bVar8 = (bool)((byte)(uVar77 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar77 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar77 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar77 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar77 >> 6) & 1);
        bVar15 = SUB81(uVar77 >> 7,0);
        auVar116._0_4_ =
             (uint)(bVar67 & 1) *
             ((uint)(bVar73 & 1) * auVar95._0_4_ | !(bool)(bVar73 & 1) * uVar79) |
             !(bool)(bVar67 & 1) * auVar116._0_4_;
        bVar9 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar116._4_4_ =
             (uint)bVar9 * ((uint)bVar8 * auVar95._4_4_ | !bVar8 * uVar78) | !bVar9 * auVar116._4_4_
        ;
        bVar8 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar116._8_4_ =
             (uint)bVar8 * ((uint)bVar10 * auVar95._8_4_ | !bVar10 * uVar130) |
             !bVar8 * auVar116._8_4_;
        bVar8 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar116._12_4_ =
             (uint)bVar8 * ((uint)bVar11 * auVar95._12_4_ | !bVar11 * uVar131) |
             !bVar8 * auVar116._12_4_;
        bVar8 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar116._16_4_ =
             (uint)bVar8 * ((uint)bVar12 * auVar95._16_4_ | !bVar12 * uVar132) |
             !bVar8 * auVar116._16_4_;
        bVar8 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar116._20_4_ =
             (uint)bVar8 * ((uint)bVar13 * auVar95._20_4_ | !bVar13 * uVar133) |
             !bVar8 * auVar116._20_4_;
        bVar8 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar116._24_4_ =
             (uint)bVar8 * ((uint)bVar14 * auVar95._24_4_ | !bVar14 * uVar134) |
             !bVar8 * auVar116._24_4_;
        bVar8 = SUB81(uVar70 >> 7,0);
        auVar116._28_4_ =
             (uint)bVar8 * ((uint)bVar15 * auVar95._28_4_ | !bVar15 * uVar135) |
             !bVar8 * auVar116._28_4_;
        bVar65 = (~bVar67 | bVar73) & bVar65;
      }
      if ((bVar65 & 0x7f) == 0) {
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar254 = ZEXT3264(auVar95);
        goto LAB_01d45f84;
      }
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar103 = vxorps_avx512vl(auVar91,auVar95);
      auVar104 = vxorps_avx512vl(auVar104,auVar95);
      uVar79 = *(uint *)(ray + k * 4 + 0x80);
      auVar90 = vxorps_avx512vl(auVar90,auVar95);
      auVar82 = vsubss_avx512f(ZEXT416(uVar79),ZEXT416((uint)local_660._0_4_));
      auVar91 = vbroadcastss_avx512vl(auVar82);
      auVar91 = vminps_avx512vl(auVar91,auVar116);
      auVar63._4_4_ = fStack_25c;
      auVar63._0_4_ = local_260;
      auVar63._8_4_ = fStack_258;
      auVar63._12_4_ = fStack_254;
      auVar63._16_4_ = fStack_250;
      auVar63._20_4_ = fStack_24c;
      auVar63._24_4_ = fStack_248;
      auVar63._28_4_ = fStack_244;
      auVar105 = vmaxps_avx512vl(auVar63,auVar115);
      auVar108 = vmulps_avx512vl(auVar108,auVar48);
      auVar107 = vfmadd213ps_avx512vl(auVar107,auVar239,auVar108);
      auVar82 = vfmadd213ps_fma(auVar106,auVar238,auVar107);
      auVar106 = vmulps_avx512vl(local_700,auVar48);
      auVar106 = vfmadd231ps_avx512vl(auVar106,local_3c0,auVar239);
      auVar106 = vfmadd231ps_avx512vl(auVar106,local_3a0,auVar238);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar106,auVar107);
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar16 = vcmpps_avx512vl(auVar107,auVar108,1);
      auVar110 = vxorps_avx512vl(ZEXT1632(auVar82),auVar95);
      auVar113 = vrcp14ps_avx512vl(auVar106);
      auVar114 = vxorps_avx512vl(auVar106,auVar95);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar118 = vfnmadd213ps_avx512vl(auVar113,auVar106,auVar117);
      auVar82 = vfmadd132ps_fma(auVar118,auVar113,auVar113);
      fVar152 = auVar82._0_4_ * auVar110._0_4_;
      fVar167 = auVar82._4_4_ * auVar110._4_4_;
      auVar51._4_4_ = fVar167;
      auVar51._0_4_ = fVar152;
      fVar169 = auVar82._8_4_ * auVar110._8_4_;
      auVar51._8_4_ = fVar169;
      fVar171 = auVar82._12_4_ * auVar110._12_4_;
      auVar51._12_4_ = fVar171;
      fVar173 = auVar110._16_4_ * 0.0;
      auVar51._16_4_ = fVar173;
      fVar175 = auVar110._20_4_ * 0.0;
      auVar51._20_4_ = fVar175;
      fVar176 = auVar110._24_4_ * 0.0;
      auVar51._24_4_ = fVar176;
      auVar51._28_4_ = auVar110._28_4_;
      uVar18 = vcmpps_avx512vl(auVar106,auVar114,1);
      bVar67 = (byte)uVar16 | (byte)uVar18;
      auVar232._8_4_ = 0xff800000;
      auVar232._0_8_ = 0xff800000ff800000;
      auVar232._12_4_ = 0xff800000;
      auVar232._16_4_ = 0xff800000;
      auVar232._20_4_ = 0xff800000;
      auVar232._24_4_ = 0xff800000;
      auVar232._28_4_ = 0xff800000;
      auVar118 = vblendmps_avx512vl(auVar51,auVar232);
      auVar119._0_4_ =
           (uint)(bVar67 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar113._0_4_;
      bVar8 = (bool)(bVar67 >> 1 & 1);
      auVar119._4_4_ = (uint)bVar8 * auVar118._4_4_ | (uint)!bVar8 * auVar113._4_4_;
      bVar8 = (bool)(bVar67 >> 2 & 1);
      auVar119._8_4_ = (uint)bVar8 * auVar118._8_4_ | (uint)!bVar8 * auVar113._8_4_;
      bVar8 = (bool)(bVar67 >> 3 & 1);
      auVar119._12_4_ = (uint)bVar8 * auVar118._12_4_ | (uint)!bVar8 * auVar113._12_4_;
      bVar8 = (bool)(bVar67 >> 4 & 1);
      auVar119._16_4_ = (uint)bVar8 * auVar118._16_4_ | (uint)!bVar8 * auVar113._16_4_;
      bVar8 = (bool)(bVar67 >> 5 & 1);
      auVar119._20_4_ = (uint)bVar8 * auVar118._20_4_ | (uint)!bVar8 * auVar113._20_4_;
      bVar8 = (bool)(bVar67 >> 6 & 1);
      auVar119._24_4_ = (uint)bVar8 * auVar118._24_4_ | (uint)!bVar8 * auVar113._24_4_;
      auVar119._28_4_ =
           (uint)(bVar67 >> 7) * auVar118._28_4_ | (uint)!(bool)(bVar67 >> 7) * auVar113._28_4_;
      auVar113 = vmaxps_avx512vl(auVar105,auVar119);
      uVar18 = vcmpps_avx512vl(auVar106,auVar114,6);
      bVar67 = (byte)uVar16 | (byte)uVar18;
      auVar120._0_4_ = (uint)(bVar67 & 1) * 0x7f800000 | (uint)!(bool)(bVar67 & 1) * (int)fVar152;
      bVar8 = (bool)(bVar67 >> 1 & 1);
      auVar120._4_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar167;
      bVar8 = (bool)(bVar67 >> 2 & 1);
      auVar120._8_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar169;
      bVar8 = (bool)(bVar67 >> 3 & 1);
      auVar120._12_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar171;
      bVar8 = (bool)(bVar67 >> 4 & 1);
      auVar120._16_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar173;
      bVar8 = (bool)(bVar67 >> 5 & 1);
      auVar120._20_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar175;
      bVar8 = (bool)(bVar67 >> 6 & 1);
      auVar120._24_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar176;
      auVar120._28_4_ =
           (uint)(bVar67 >> 7) * 0x7f800000 | (uint)!(bool)(bVar67 >> 7) * auVar110._28_4_;
      auVar91 = vminps_avx512vl(auVar91,auVar120);
      auVar82 = vxorps_avx512vl(auVar105._0_16_,auVar105._0_16_);
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar82),auVar100);
      auVar101 = vsubps_avx512vl(ZEXT1632(auVar82),auVar101);
      auVar105 = ZEXT1632(auVar82);
      auVar102 = vsubps_avx512vl(auVar105,auVar102);
      auVar102 = vmulps_avx512vl(auVar102,auVar103);
      auVar101 = vfmadd231ps_avx512vl(auVar102,auVar90,auVar101);
      auVar100 = vfmadd231ps_avx512vl(auVar101,auVar104,auVar100);
      auVar101 = vmulps_avx512vl(local_700,auVar103);
      auVar101 = vfmadd231ps_avx512vl(auVar101,local_3c0,auVar90);
      auVar101 = vfmadd231ps_avx512vl(auVar101,local_3a0,auVar104);
      vandps_avx512vl(auVar101,auVar107);
      uVar16 = vcmpps_avx512vl(auVar101,auVar108,1);
      auVar100 = vxorps_avx512vl(auVar100,auVar95);
      auVar102 = vrcp14ps_avx512vl(auVar101);
      auVar95 = vxorps_avx512vl(auVar101,auVar95);
      auVar103 = vfnmadd213ps_avx512vl(auVar102,auVar101,auVar117);
      auVar82 = vfmadd132ps_fma(auVar103,auVar102,auVar102);
      fVar152 = auVar82._0_4_ * auVar100._0_4_;
      fVar167 = auVar82._4_4_ * auVar100._4_4_;
      auVar52._4_4_ = fVar167;
      auVar52._0_4_ = fVar152;
      fVar169 = auVar82._8_4_ * auVar100._8_4_;
      auVar52._8_4_ = fVar169;
      fVar171 = auVar82._12_4_ * auVar100._12_4_;
      auVar52._12_4_ = fVar171;
      fVar173 = auVar100._16_4_ * 0.0;
      auVar52._16_4_ = fVar173;
      fVar175 = auVar100._20_4_ * 0.0;
      auVar52._20_4_ = fVar175;
      fVar176 = auVar100._24_4_ * 0.0;
      auVar52._24_4_ = fVar176;
      auVar52._28_4_ = auVar100._28_4_;
      uVar18 = vcmpps_avx512vl(auVar101,auVar95,1);
      bVar67 = (byte)uVar16 | (byte)uVar18;
      auVar103 = vblendmps_avx512vl(auVar52,auVar232);
      auVar121._0_4_ =
           (uint)(bVar67 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar102._0_4_;
      bVar8 = (bool)(bVar67 >> 1 & 1);
      auVar121._4_4_ = (uint)bVar8 * auVar103._4_4_ | (uint)!bVar8 * auVar102._4_4_;
      bVar8 = (bool)(bVar67 >> 2 & 1);
      auVar121._8_4_ = (uint)bVar8 * auVar103._8_4_ | (uint)!bVar8 * auVar102._8_4_;
      bVar8 = (bool)(bVar67 >> 3 & 1);
      auVar121._12_4_ = (uint)bVar8 * auVar103._12_4_ | (uint)!bVar8 * auVar102._12_4_;
      bVar8 = (bool)(bVar67 >> 4 & 1);
      auVar121._16_4_ = (uint)bVar8 * auVar103._16_4_ | (uint)!bVar8 * auVar102._16_4_;
      bVar8 = (bool)(bVar67 >> 5 & 1);
      auVar121._20_4_ = (uint)bVar8 * auVar103._20_4_ | (uint)!bVar8 * auVar102._20_4_;
      bVar8 = (bool)(bVar67 >> 6 & 1);
      auVar121._24_4_ = (uint)bVar8 * auVar103._24_4_ | (uint)!bVar8 * auVar102._24_4_;
      auVar121._28_4_ =
           (uint)(bVar67 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar67 >> 7) * auVar102._28_4_;
      _local_600 = vmaxps_avx(auVar113,auVar121);
      uVar18 = vcmpps_avx512vl(auVar101,auVar95,6);
      bVar67 = (byte)uVar16 | (byte)uVar18;
      auVar122._0_4_ = (uint)(bVar67 & 1) * 0x7f800000 | (uint)!(bool)(bVar67 & 1) * (int)fVar152;
      bVar8 = (bool)(bVar67 >> 1 & 1);
      auVar122._4_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar167;
      bVar8 = (bool)(bVar67 >> 2 & 1);
      auVar122._8_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar169;
      bVar8 = (bool)(bVar67 >> 3 & 1);
      auVar122._12_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar171;
      bVar8 = (bool)(bVar67 >> 4 & 1);
      auVar122._16_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar173;
      bVar8 = (bool)(bVar67 >> 5 & 1);
      auVar122._20_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar175;
      bVar8 = (bool)(bVar67 >> 6 & 1);
      auVar122._24_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar176;
      auVar122._28_4_ =
           (uint)(bVar67 >> 7) * 0x7f800000 | (uint)!(bool)(bVar67 >> 7) * auVar100._28_4_;
      local_2e0 = vminps_avx(auVar91,auVar122);
      uVar16 = vcmpps_avx512vl(_local_600,local_2e0,2);
      bVar65 = bVar65 & 0x7f & (byte)uVar16;
      if (bVar65 == 0) {
        auVar254 = ZEXT3264(auVar117);
        goto LAB_01d45f84;
      }
      auVar100 = vmaxps_avx512vl(auVar105,local_780);
      auVar95 = vfmadd213ps_avx512vl(local_4e0,auVar111,auVar92);
      fVar152 = auVar93._0_4_;
      fVar167 = auVar93._4_4_;
      auVar53._4_4_ = fVar167 * auVar95._4_4_;
      auVar53._0_4_ = fVar152 * auVar95._0_4_;
      fVar169 = auVar93._8_4_;
      auVar53._8_4_ = fVar169 * auVar95._8_4_;
      fVar171 = auVar93._12_4_;
      auVar53._12_4_ = fVar171 * auVar95._12_4_;
      fVar173 = auVar93._16_4_;
      auVar53._16_4_ = fVar173 * auVar95._16_4_;
      fVar175 = auVar93._20_4_;
      auVar53._20_4_ = fVar175 * auVar95._20_4_;
      fVar176 = auVar93._24_4_;
      auVar53._24_4_ = fVar176 * auVar95._24_4_;
      auVar53._28_4_ = auVar95._28_4_;
      auVar95 = vfmadd213ps_avx512vl(local_760,auVar111,auVar92);
      auVar54._4_4_ = fVar167 * auVar95._4_4_;
      auVar54._0_4_ = fVar152 * auVar95._0_4_;
      auVar54._8_4_ = fVar169 * auVar95._8_4_;
      auVar54._12_4_ = fVar171 * auVar95._12_4_;
      auVar54._16_4_ = fVar173 * auVar95._16_4_;
      auVar54._20_4_ = fVar175 * auVar95._20_4_;
      auVar54._24_4_ = fVar176 * auVar95._24_4_;
      auVar54._28_4_ = auVar121._28_4_;
      auVar95 = vminps_avx512vl(auVar53,auVar117);
      auVar60 = ZEXT812(0);
      auVar101 = ZEXT1232(auVar60) << 0x20;
      auVar95 = vmaxps_avx(auVar95,ZEXT1232(auVar60) << 0x20);
      auVar102 = vminps_avx512vl(auVar54,auVar117);
      auVar55._4_4_ = (auVar95._4_4_ + 1.0) * 0.125;
      auVar55._0_4_ = (auVar95._0_4_ + 0.0) * 0.125;
      auVar55._8_4_ = (auVar95._8_4_ + 2.0) * 0.125;
      auVar55._12_4_ = (auVar95._12_4_ + 3.0) * 0.125;
      auVar55._16_4_ = (auVar95._16_4_ + 4.0) * 0.125;
      auVar55._20_4_ = (auVar95._20_4_ + 5.0) * 0.125;
      auVar55._24_4_ = (auVar95._24_4_ + 6.0) * 0.125;
      auVar55._28_4_ = auVar95._28_4_ + 7.0;
      auVar82 = vfmadd213ps_fma(auVar55,local_740,auVar208);
      local_1a0 = ZEXT1632(auVar82);
      auVar95 = vmaxps_avx(auVar102,ZEXT1232(auVar60) << 0x20);
      auVar56._4_4_ = (auVar95._4_4_ + 1.0) * 0.125;
      auVar56._0_4_ = (auVar95._0_4_ + 0.0) * 0.125;
      auVar56._8_4_ = (auVar95._8_4_ + 2.0) * 0.125;
      auVar56._12_4_ = (auVar95._12_4_ + 3.0) * 0.125;
      auVar56._16_4_ = (auVar95._16_4_ + 4.0) * 0.125;
      auVar56._20_4_ = (auVar95._20_4_ + 5.0) * 0.125;
      auVar56._24_4_ = (auVar95._24_4_ + 6.0) * 0.125;
      auVar56._28_4_ = auVar95._28_4_ + 7.0;
      auVar82 = vfmadd213ps_fma(auVar56,local_740,auVar208);
      local_1c0 = ZEXT1632(auVar82);
      auVar57._4_4_ = auVar100._4_4_ * auVar100._4_4_;
      auVar57._0_4_ = auVar100._0_4_ * auVar100._0_4_;
      auVar57._8_4_ = auVar100._8_4_ * auVar100._8_4_;
      auVar57._12_4_ = auVar100._12_4_ * auVar100._12_4_;
      auVar57._16_4_ = auVar100._16_4_ * auVar100._16_4_;
      auVar57._20_4_ = auVar100._20_4_ * auVar100._20_4_;
      auVar57._24_4_ = auVar100._24_4_ * auVar100._24_4_;
      auVar57._28_4_ = auVar100._28_4_;
      auVar95 = vsubps_avx(local_7a0,auVar57);
      auVar58._4_4_ = auVar95._4_4_ * (float)local_4c0._4_4_;
      auVar58._0_4_ = auVar95._0_4_ * (float)local_4c0._0_4_;
      auVar58._8_4_ = auVar95._8_4_ * fStack_4b8;
      auVar58._12_4_ = auVar95._12_4_ * fStack_4b4;
      auVar58._16_4_ = auVar95._16_4_ * fStack_4b0;
      auVar58._20_4_ = auVar95._20_4_ * fStack_4ac;
      auVar58._24_4_ = auVar95._24_4_ * fStack_4a8;
      auVar58._28_4_ = auVar100._28_4_;
      auVar100 = vsubps_avx(local_680,auVar58);
      uVar70 = vcmpps_avx512vl(auVar100,ZEXT1232(auVar60) << 0x20,5);
      auVar249 = ZEXT3264(local_840);
      if ((byte)uVar70 == 0) {
        uVar70 = 0;
        auVar93 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar96 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar102 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar103 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar123._8_4_ = 0x7f800000;
        auVar123._0_8_ = 0x7f8000007f800000;
        auVar123._12_4_ = 0x7f800000;
        auVar123._16_4_ = 0x7f800000;
        auVar123._20_4_ = 0x7f800000;
        auVar123._24_4_ = 0x7f800000;
        auVar123._28_4_ = 0x7f800000;
        auVar124._8_4_ = 0xff800000;
        auVar124._0_8_ = 0xff800000ff800000;
        auVar124._12_4_ = 0xff800000;
        auVar124._16_4_ = 0xff800000;
        auVar124._20_4_ = 0xff800000;
        auVar124._24_4_ = 0xff800000;
        auVar124._28_4_ = 0xff800000;
      }
      else {
        uVar77 = vcmpps_avx512vl(auVar100,auVar105,5);
        auVar100 = vsqrtps_avx(auVar100);
        auVar101 = vfnmadd213ps_avx512vl(auVar112,local_540,auVar117);
        auVar103 = vfmadd132ps_avx512vl(auVar101,local_540,local_540);
        auVar101 = vsubps_avx(local_6a0,auVar100);
        auVar104 = vmulps_avx512vl(auVar101,auVar103);
        auVar100 = vsubps_avx512vl(auVar100,auVar109);
        auVar90 = vmulps_avx512vl(auVar100,auVar103);
        auVar100 = vfmadd213ps_avx512vl(auVar111,auVar104,auVar92);
        auVar59._4_4_ = fVar167 * auVar100._4_4_;
        auVar59._0_4_ = fVar152 * auVar100._0_4_;
        auVar59._8_4_ = fVar169 * auVar100._8_4_;
        auVar59._12_4_ = fVar171 * auVar100._12_4_;
        auVar59._16_4_ = fVar173 * auVar100._16_4_;
        auVar59._20_4_ = fVar175 * auVar100._20_4_;
        auVar59._24_4_ = fVar176 * auVar100._24_4_;
        auVar59._28_4_ = auVar102._28_4_;
        auVar100 = vmulps_avx512vl(local_3a0,auVar104);
        auVar101 = vmulps_avx512vl(local_3c0,auVar104);
        auVar91 = vmulps_avx512vl(local_700,auVar104);
        auVar102 = vfmadd213ps_avx512vl(auVar96,auVar59,auVar215);
        auVar102 = vsubps_avx512vl(auVar100,auVar102);
        auVar100 = vfmadd213ps_avx512vl(auVar97,auVar59,auVar94);
        auVar103 = vsubps_avx512vl(auVar101,auVar100);
        auVar82 = vfmadd213ps_fma(auVar59,auVar98,auVar99);
        auVar100 = vsubps_avx(auVar91,ZEXT1632(auVar82));
        auVar101 = vfmadd213ps_avx512vl(auVar111,auVar90,auVar92);
        auVar92 = vmulps_avx512vl(auVar93,auVar101);
        auVar93 = vmulps_avx512vl(local_3a0,auVar90);
        auVar91 = vmulps_avx512vl(local_3c0,auVar90);
        auVar105 = vmulps_avx512vl(local_700,auVar90);
        auVar82 = vfmadd213ps_fma(auVar96,auVar92,auVar215);
        auVar101 = vsubps_avx(auVar93,ZEXT1632(auVar82));
        auVar82 = vfmadd213ps_fma(auVar97,auVar92,auVar94);
        auVar93 = vsubps_avx512vl(auVar91,ZEXT1632(auVar82));
        auVar82 = vfmadd213ps_fma(auVar98,auVar92,auVar99);
        auVar96 = vsubps_avx512vl(auVar105,ZEXT1632(auVar82));
        auVar198._8_4_ = 0x7f800000;
        auVar198._0_8_ = 0x7f8000007f800000;
        auVar198._12_4_ = 0x7f800000;
        auVar198._16_4_ = 0x7f800000;
        auVar198._20_4_ = 0x7f800000;
        auVar198._24_4_ = 0x7f800000;
        auVar198._28_4_ = 0x7f800000;
        auVar97 = vblendmps_avx512vl(auVar198,auVar104);
        bVar8 = (bool)((byte)uVar77 & 1);
        auVar123._0_4_ = (uint)bVar8 * auVar97._0_4_ | (uint)!bVar8 * auVar86._0_4_;
        bVar8 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar123._4_4_ = (uint)bVar8 * auVar97._4_4_ | (uint)!bVar8 * auVar86._4_4_;
        bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar123._8_4_ = (uint)bVar8 * auVar97._8_4_ | (uint)!bVar8 * auVar86._8_4_;
        bVar8 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar123._12_4_ = (uint)bVar8 * auVar97._12_4_ | (uint)!bVar8 * auVar86._12_4_;
        iVar1 = (uint)((byte)(uVar77 >> 4) & 1) * auVar97._16_4_;
        auVar123._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar77 >> 5) & 1) * auVar97._20_4_;
        auVar123._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar77 >> 6) & 1) * auVar97._24_4_;
        auVar123._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar77 >> 7) * auVar97._28_4_;
        auVar123._28_4_ = iVar4;
        auVar199._8_4_ = 0xff800000;
        auVar199._0_8_ = 0xff800000ff800000;
        auVar199._12_4_ = 0xff800000;
        auVar199._16_4_ = 0xff800000;
        auVar199._20_4_ = 0xff800000;
        auVar199._24_4_ = 0xff800000;
        auVar199._28_4_ = 0xff800000;
        auVar97 = vblendmps_avx512vl(auVar199,auVar90);
        bVar8 = (bool)((byte)uVar77 & 1);
        auVar124._0_4_ = (uint)bVar8 * auVar97._0_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar8 * auVar97._4_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar8 * auVar97._8_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar8 * auVar97._12_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar124._16_4_ = (uint)bVar8 * auVar97._16_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar124._20_4_ = (uint)bVar8 * auVar97._20_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar124._24_4_ = (uint)bVar8 * auVar97._24_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = SUB81(uVar77 >> 7,0);
        auVar124._28_4_ = (uint)bVar8 * auVar97._28_4_ | (uint)!bVar8 * -0x800000;
        auVar37._8_4_ = 0x36000000;
        auVar37._0_8_ = 0x3600000036000000;
        auVar37._12_4_ = 0x36000000;
        auVar37._16_4_ = 0x36000000;
        auVar37._20_4_ = 0x36000000;
        auVar37._24_4_ = 0x36000000;
        auVar37._28_4_ = 0x36000000;
        auVar97 = vmulps_avx512vl(local_500,auVar37);
        uVar17 = vcmpps_avx512vl(auVar97,local_520,0xe);
        uVar77 = uVar77 & uVar17;
        bVar67 = (byte)uVar77;
        if (bVar67 != 0) {
          uVar17 = vcmpps_avx512vl(auVar95,ZEXT1632(ZEXT816(0) << 0x40),2);
          auVar231._8_4_ = 0x7f800000;
          auVar231._0_8_ = 0x7f8000007f800000;
          auVar231._12_4_ = 0x7f800000;
          auVar231._16_4_ = 0x7f800000;
          auVar231._20_4_ = 0x7f800000;
          auVar231._24_4_ = 0x7f800000;
          auVar231._28_4_ = 0x7f800000;
          auVar233._8_4_ = 0xff800000;
          auVar233._0_8_ = 0xff800000ff800000;
          auVar233._12_4_ = 0xff800000;
          auVar233._16_4_ = 0xff800000;
          auVar233._20_4_ = 0xff800000;
          auVar233._24_4_ = 0xff800000;
          auVar233._28_4_ = 0xff800000;
          auVar95 = vblendmps_avx512vl(auVar231,auVar233);
          bVar73 = (byte)uVar17;
          uVar78 = (uint)(bVar73 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar97._0_4_;
          bVar8 = (bool)((byte)(uVar17 >> 1) & 1);
          uVar130 = (uint)bVar8 * auVar95._4_4_ | (uint)!bVar8 * auVar97._4_4_;
          bVar8 = (bool)((byte)(uVar17 >> 2) & 1);
          uVar131 = (uint)bVar8 * auVar95._8_4_ | (uint)!bVar8 * auVar97._8_4_;
          bVar8 = (bool)((byte)(uVar17 >> 3) & 1);
          uVar132 = (uint)bVar8 * auVar95._12_4_ | (uint)!bVar8 * auVar97._12_4_;
          bVar8 = (bool)((byte)(uVar17 >> 4) & 1);
          uVar133 = (uint)bVar8 * auVar95._16_4_ | (uint)!bVar8 * auVar97._16_4_;
          bVar8 = (bool)((byte)(uVar17 >> 5) & 1);
          uVar134 = (uint)bVar8 * auVar95._20_4_ | (uint)!bVar8 * auVar97._20_4_;
          bVar8 = (bool)((byte)(uVar17 >> 6) & 1);
          uVar135 = (uint)bVar8 * auVar95._24_4_ | (uint)!bVar8 * auVar97._24_4_;
          bVar8 = SUB81(uVar17 >> 7,0);
          uVar136 = (uint)bVar8 * auVar95._28_4_ | (uint)!bVar8 * auVar97._28_4_;
          auVar123._0_4_ = (bVar67 & 1) * uVar78 | !(bool)(bVar67 & 1) * auVar123._0_4_;
          bVar8 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar123._4_4_ = bVar8 * uVar130 | !bVar8 * auVar123._4_4_;
          bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar123._8_4_ = bVar8 * uVar131 | !bVar8 * auVar123._8_4_;
          bVar8 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar123._12_4_ = bVar8 * uVar132 | !bVar8 * auVar123._12_4_;
          bVar8 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar123._16_4_ = bVar8 * uVar133 | (uint)!bVar8 * iVar1;
          bVar8 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar123._20_4_ = bVar8 * uVar134 | (uint)!bVar8 * iVar2;
          bVar8 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar123._24_4_ = bVar8 * uVar135 | (uint)!bVar8 * iVar3;
          bVar8 = SUB81(uVar77 >> 7,0);
          auVar123._28_4_ = bVar8 * uVar136 | (uint)!bVar8 * iVar4;
          auVar95 = vblendmps_avx512vl(auVar233,auVar231);
          bVar8 = (bool)((byte)(uVar17 >> 1) & 1);
          bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
          bVar11 = (bool)((byte)(uVar17 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar17 >> 4) & 1);
          bVar13 = (bool)((byte)(uVar17 >> 5) & 1);
          bVar14 = (bool)((byte)(uVar17 >> 6) & 1);
          bVar15 = SUB81(uVar17 >> 7,0);
          auVar124._0_4_ =
               (uint)(bVar67 & 1) *
               ((uint)(bVar73 & 1) * auVar95._0_4_ | !(bool)(bVar73 & 1) * uVar78) |
               !(bool)(bVar67 & 1) * auVar124._0_4_;
          bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar124._4_4_ =
               (uint)bVar9 * ((uint)bVar8 * auVar95._4_4_ | !bVar8 * uVar130) |
               !bVar9 * auVar124._4_4_;
          bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar124._8_4_ =
               (uint)bVar8 * ((uint)bVar10 * auVar95._8_4_ | !bVar10 * uVar131) |
               !bVar8 * auVar124._8_4_;
          bVar8 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar124._12_4_ =
               (uint)bVar8 * ((uint)bVar11 * auVar95._12_4_ | !bVar11 * uVar132) |
               !bVar8 * auVar124._12_4_;
          bVar8 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar124._16_4_ =
               (uint)bVar8 * ((uint)bVar12 * auVar95._16_4_ | !bVar12 * uVar133) |
               !bVar8 * auVar124._16_4_;
          bVar8 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar124._20_4_ =
               (uint)bVar8 * ((uint)bVar13 * auVar95._20_4_ | !bVar13 * uVar134) |
               !bVar8 * auVar124._20_4_;
          bVar8 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar124._24_4_ =
               (uint)bVar8 * ((uint)bVar14 * auVar95._24_4_ | !bVar14 * uVar135) |
               !bVar8 * auVar124._24_4_;
          bVar8 = SUB81(uVar77 >> 7,0);
          auVar124._28_4_ =
               (uint)bVar8 * ((uint)bVar15 * auVar95._28_4_ | !bVar15 * uVar136) |
               !bVar8 * auVar124._28_4_;
          uVar70 = (ulong)(byte)((~bVar67 | bVar73) & (byte)uVar70);
        }
      }
      auVar255 = ZEXT3264(local_8c0);
      auVar242 = ZEXT3264(local_8e0);
      auVar243 = ZEXT3264(local_900);
      auVar244 = ZEXT3264(local_920);
      auVar246 = ZEXT3264(local_940);
      auVar248 = ZEXT3264(local_960);
      auVar252 = ZEXT3264(local_980);
      auVar253 = ZEXT3264(local_9a0);
      auVar251 = ZEXT3264(local_700);
      auVar95 = vmulps_avx512vl(local_700,auVar96);
      auVar82 = vfmadd231ps_fma(auVar95,local_3c0,auVar93);
      auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),local_3a0,auVar101);
      _local_200 = _local_600;
      local_1e0 = vminps_avx(local_2e0,auVar123);
      auVar229._8_4_ = 0x7fffffff;
      auVar229._0_8_ = 0x7fffffff7fffffff;
      auVar229._12_4_ = 0x7fffffff;
      auVar229._16_4_ = 0x7fffffff;
      auVar229._20_4_ = 0x7fffffff;
      auVar229._24_4_ = 0x7fffffff;
      auVar229._28_4_ = 0x7fffffff;
      auVar95 = vandps_avx(ZEXT1632(auVar82),auVar229);
      auVar93 = vmaxps_avx(_local_600,auVar124);
      local_300 = auVar93;
      auVar201._8_4_ = 0x3e99999a;
      auVar201._0_8_ = 0x3e99999a3e99999a;
      auVar201._12_4_ = 0x3e99999a;
      auVar201._16_4_ = 0x3e99999a;
      auVar201._20_4_ = 0x3e99999a;
      auVar201._24_4_ = 0x3e99999a;
      auVar201._28_4_ = 0x3e99999a;
      uVar16 = vcmpps_avx512vl(auVar95,auVar201,1);
      local_380._0_2_ = (short)uVar16;
      uVar16 = vcmpps_avx512vl(_local_600,local_1e0,2);
      bVar67 = (byte)uVar16 & bVar65;
      uVar18 = vcmpps_avx512vl(auVar93,local_2e0,2);
      auVar240 = ZEXT3264(local_7c0);
      auVar241 = ZEXT3264(local_7e0);
      auVar245 = ZEXT3264(local_800);
      auVar247 = ZEXT3264(local_820);
      if ((bVar65 & ((byte)uVar18 | (byte)uVar16)) == 0) {
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar254 = ZEXT3264(auVar95);
        auVar234 = ZEXT3264(local_8a0);
        auVar230 = ZEXT3264(local_560);
        auVar216 = ZEXT3264(local_6e0);
      }
      else {
        uVar77 = CONCAT71((int7)(uVar70 >> 8),~(byte)uVar70);
        auVar95 = vmulps_avx512vl(local_700,auVar100);
        auVar82 = vfmadd213ps_fma(auVar103,local_3c0,auVar95);
        auVar82 = vfmadd213ps_fma(auVar102,local_3a0,ZEXT1632(auVar82));
        auVar95 = vandps_avx(ZEXT1632(auVar82),auVar229);
        uVar16 = vcmpps_avx512vl(auVar95,auVar201,1);
        bVar73 = (byte)uVar16 | ~(byte)uVar70;
        auVar147._8_4_ = 2;
        auVar147._0_8_ = 0x200000002;
        auVar147._12_4_ = 2;
        auVar147._16_4_ = 2;
        auVar147._20_4_ = 2;
        auVar147._24_4_ = 2;
        auVar147._28_4_ = 2;
        auVar38._8_4_ = 3;
        auVar38._0_8_ = 0x300000003;
        auVar38._12_4_ = 3;
        auVar38._16_4_ = 3;
        auVar38._20_4_ = 3;
        auVar38._24_4_ = 3;
        auVar38._28_4_ = 3;
        auVar95 = vpblendmd_avx512vl(auVar147,auVar38);
        local_2a0._0_4_ = (uint)(bVar73 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar73 & 1) * 2;
        bVar8 = (bool)(bVar73 >> 1 & 1);
        local_2a0._4_4_ = (uint)bVar8 * auVar95._4_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar73 >> 2 & 1);
        local_2a0._8_4_ = (uint)bVar8 * auVar95._8_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar73 >> 3 & 1);
        local_2a0._12_4_ = (uint)bVar8 * auVar95._12_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar73 >> 4 & 1);
        local_2a0._16_4_ = (uint)bVar8 * auVar95._16_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar73 >> 5 & 1);
        local_2a0._20_4_ = (uint)bVar8 * auVar95._20_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar73 >> 6 & 1);
        local_2a0._24_4_ = (uint)bVar8 * auVar95._24_4_ | (uint)!bVar8 * 2;
        local_2a0._28_4_ = (uint)(bVar73 >> 7) * auVar95._28_4_ | (uint)!(bool)(bVar73 >> 7) * 2;
        local_320 = vpbroadcastd_avx512vl();
        uVar16 = vpcmpd_avx512vl(local_320,local_2a0,5);
        bVar73 = (byte)uVar16 & bVar67;
        auVar234 = ZEXT3264(local_8a0);
        if (bVar73 == 0) {
          auVar149._4_4_ = uVar79;
          auVar149._0_4_ = uVar79;
          auVar149._8_4_ = uVar79;
          auVar149._12_4_ = uVar79;
          auVar149._16_4_ = uVar79;
          auVar149._20_4_ = uVar79;
          auVar149._24_4_ = uVar79;
          auVar149._28_4_ = uVar79;
        }
        else {
          local_2c0 = auVar93;
          local_9ac = (uint)uVar77;
          auVar85 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar82 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar83 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar84 = vminps_avx(auVar85,auVar83);
          auVar85 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar83 = vmaxps_avx(auVar82,auVar85);
          auVar177._8_4_ = 0x7fffffff;
          auVar177._0_8_ = 0x7fffffff7fffffff;
          auVar177._12_4_ = 0x7fffffff;
          auVar82 = vandps_avx(auVar84,auVar177);
          auVar85 = vandps_avx(auVar83,auVar177);
          auVar82 = vmaxps_avx(auVar82,auVar85);
          auVar85 = vmovshdup_avx(auVar82);
          auVar85 = vmaxss_avx(auVar85,auVar82);
          auVar82 = vshufpd_avx(auVar82,auVar82,1);
          auVar82 = vmaxss_avx(auVar82,auVar85);
          fVar137 = auVar82._0_4_ * 1.9073486e-06;
          local_650 = vshufps_avx(auVar83,auVar83,0xff);
          local_360 = (float)local_6c0._0_4_ + (float)local_600._0_4_;
          fStack_35c = (float)local_6c0._4_4_ + (float)local_600._4_4_;
          fStack_358 = fStack_6b8 + fStack_5f8;
          fStack_354 = fStack_6b4 + fStack_5f4;
          fStack_350 = fStack_6b0 + fStack_5f0;
          fStack_34c = fStack_6ac + fStack_5ec;
          fStack_348 = fStack_6a8 + fStack_5e8;
          fStack_344 = fStack_6a4 + fStack_5e4;
          do {
            auVar148._8_4_ = 0x7f800000;
            auVar148._0_8_ = 0x7f8000007f800000;
            auVar148._12_4_ = 0x7f800000;
            auVar148._16_4_ = 0x7f800000;
            auVar148._20_4_ = 0x7f800000;
            auVar148._24_4_ = 0x7f800000;
            auVar148._28_4_ = 0x7f800000;
            auVar95 = vblendmps_avx512vl(auVar148,_local_600);
            auVar126._0_4_ =
                 (uint)(bVar73 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar73 & 1) * 0x7f800000;
            bVar8 = (bool)(bVar73 >> 1 & 1);
            auVar126._4_4_ = (uint)bVar8 * auVar95._4_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar73 >> 2 & 1);
            auVar126._8_4_ = (uint)bVar8 * auVar95._8_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar73 >> 3 & 1);
            auVar126._12_4_ = (uint)bVar8 * auVar95._12_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar73 >> 4 & 1);
            auVar126._16_4_ = (uint)bVar8 * auVar95._16_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar73 >> 5 & 1);
            auVar126._20_4_ = (uint)bVar8 * auVar95._20_4_ | (uint)!bVar8 * 0x7f800000;
            auVar126._24_4_ =
                 (uint)(bVar73 >> 6) * auVar95._24_4_ | (uint)!(bool)(bVar73 >> 6) * 0x7f800000;
            auVar126._28_4_ = 0x7f800000;
            auVar95 = vshufps_avx(auVar126,auVar126,0xb1);
            auVar95 = vminps_avx(auVar126,auVar95);
            auVar93 = vshufpd_avx(auVar95,auVar95,5);
            auVar95 = vminps_avx(auVar95,auVar93);
            auVar93 = vpermpd_avx2(auVar95,0x4e);
            auVar95 = vminps_avx(auVar95,auVar93);
            uVar16 = vcmpps_avx512vl(auVar126,auVar95,0);
            bVar66 = (byte)uVar16 & bVar73;
            bVar76 = bVar73;
            if (bVar66 != 0) {
              bVar76 = bVar66;
            }
            iVar2 = 0;
            for (uVar79 = (uint)bVar76; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            auVar216 = ZEXT464(*(uint *)(local_1a0 + (uint)(iVar2 << 2)));
            fVar168 = local_9a8;
            fVar166 = *(float *)(local_200 + (uint)(iVar2 << 2));
            uVar138 = 0;
            uVar235 = 0;
            uVar236 = 0;
            if ((float)local_720._0_4_ < 0.0) {
              local_780._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar2 << 2)));
              local_7a0._0_16_ = ZEXT416((uint)*(float *)(local_200 + (uint)(iVar2 << 2)));
              fVar168 = sqrtf((float)local_720._0_4_);
              auVar216 = ZEXT1664(local_780._0_16_);
              fVar166 = (float)local_7a0._0_4_;
              uVar138 = local_7a0._4_4_;
              uVar235 = local_7a0._8_4_;
              uVar236 = local_7a0._12_4_;
            }
            lVar72 = 5;
            do {
              auVar95 = local_7a0;
              auVar139._4_4_ = fVar166;
              auVar139._0_4_ = fVar166;
              auVar139._8_4_ = fVar166;
              auVar139._12_4_ = fVar166;
              auVar85 = vfmadd132ps_fma(auVar139,ZEXT816(0) << 0x40,local_710);
              fVar151 = auVar216._0_4_;
              fVar170 = 1.0 - fVar151;
              auVar178._0_4_ = local_5c0._0_4_ * fVar151;
              auVar178._4_4_ = local_5c0._4_4_ * fVar151;
              auVar178._8_4_ = local_5c0._8_4_ * fVar151;
              auVar178._12_4_ = local_5c0._12_4_ * fVar151;
              local_4e0._0_16_ = ZEXT416((uint)fVar170);
              auVar206._4_4_ = fVar170;
              auVar206._0_4_ = fVar170;
              auVar206._8_4_ = fVar170;
              auVar206._12_4_ = fVar170;
              auVar82 = vfmadd231ps_fma(auVar178,auVar206,local_580._0_16_);
              auVar209._0_4_ = local_5a0._0_4_ * fVar151;
              auVar209._4_4_ = local_5a0._4_4_ * fVar151;
              auVar209._8_4_ = local_5a0._8_4_ * fVar151;
              auVar209._12_4_ = local_5a0._12_4_ * fVar151;
              auVar83 = vfmadd231ps_fma(auVar209,auVar206,local_5c0._0_16_);
              auVar217._0_4_ = fVar151 * (float)local_5e0._0_4_;
              auVar217._4_4_ = fVar151 * (float)local_5e0._4_4_;
              auVar217._8_4_ = fVar151 * fStack_5d8;
              auVar217._12_4_ = fVar151 * fStack_5d4;
              auVar84 = vfmadd231ps_fma(auVar217,auVar206,local_5a0._0_16_);
              auVar224._0_4_ = fVar151 * auVar83._0_4_;
              auVar224._4_4_ = fVar151 * auVar83._4_4_;
              auVar224._8_4_ = fVar151 * auVar83._8_4_;
              auVar224._12_4_ = fVar151 * auVar83._12_4_;
              auVar82 = vfmadd231ps_fma(auVar224,auVar206,auVar82);
              auVar179._0_4_ = fVar151 * auVar84._0_4_;
              auVar179._4_4_ = fVar151 * auVar84._4_4_;
              auVar179._8_4_ = fVar151 * auVar84._8_4_;
              auVar179._12_4_ = fVar151 * auVar84._12_4_;
              auVar83 = vfmadd231ps_fma(auVar179,auVar206,auVar83);
              auVar210._0_4_ = fVar151 * auVar83._0_4_;
              auVar210._4_4_ = fVar151 * auVar83._4_4_;
              auVar210._8_4_ = fVar151 * auVar83._8_4_;
              auVar210._12_4_ = fVar151 * auVar83._12_4_;
              auVar84 = vfmadd231ps_fma(auVar210,auVar82,auVar206);
              auVar82 = vsubps_avx(auVar83,auVar82);
              auVar20._8_4_ = 0x40400000;
              auVar20._0_8_ = 0x4040000040400000;
              auVar20._12_4_ = 0x40400000;
              auVar83 = vmulps_avx512vl(auVar82,auVar20);
              _local_4c0 = auVar84;
              auVar82 = vsubps_avx(auVar85,auVar84);
              local_740._0_16_ = auVar82;
              auVar82 = vdpps_avx(auVar82,auVar82,0x7f);
              local_680._0_16_ = auVar82;
              local_780._0_16_ = auVar216._0_16_;
              local_7a0._4_4_ = uVar138;
              local_7a0._0_4_ = fVar166;
              local_7a0._8_4_ = uVar235;
              local_7a0._16_16_ = auVar95._16_16_;
              local_7a0._12_4_ = uVar236;
              if (auVar82._0_4_ < 0.0) {
                auVar216._0_4_ = sqrtf(auVar82._0_4_);
                auVar216._4_60_ = extraout_var;
                auVar82 = auVar216._0_16_;
              }
              else {
                auVar82 = vsqrtss_avx(auVar82,auVar82);
              }
              local_500._0_16_ = vdpps_avx(auVar83,auVar83,0x7f);
              fVar166 = local_500._0_4_;
              auVar180._4_12_ = ZEXT812(0) << 0x20;
              auVar180._0_4_ = fVar166;
              local_760._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar180);
              fVar170 = local_760._0_4_;
              local_520._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar180);
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar84 = vxorps_avx512vl(local_500._0_16_,auVar21);
              auVar85 = vfnmadd213ss_fma(local_520._0_16_,local_500._0_16_,ZEXT416(0x40000000));
              local_540._0_4_ = auVar85._0_4_;
              local_6a0._0_4_ = auVar82._0_4_;
              if (fVar166 < auVar84._0_4_) {
                auVar230._0_4_ = sqrtf(fVar166);
                auVar230._4_60_ = extraout_var_00;
                auVar82 = ZEXT416((uint)local_6a0._0_4_);
                auVar85 = auVar230._0_16_;
              }
              else {
                auVar85 = vsqrtss_avx512f(local_500._0_16_,local_500._0_16_);
              }
              fVar151 = local_760._0_4_;
              fVar166 = fVar170 * 1.5 + fVar166 * -0.5 * fVar151 * fVar151 * fVar151;
              auVar140._0_4_ = auVar83._0_4_ * fVar166;
              auVar140._4_4_ = auVar83._4_4_ * fVar166;
              auVar140._8_4_ = auVar83._8_4_ * fVar166;
              auVar140._12_4_ = auVar83._12_4_ * fVar166;
              local_760._0_16_ = vdpps_avx(local_740._0_16_,auVar140,0x7f);
              auVar86 = vaddss_avx512f(auVar82,ZEXT416(0x3f800000));
              auVar141._0_4_ = local_760._0_4_ * local_760._0_4_;
              auVar141._4_4_ = local_760._4_4_ * local_760._4_4_;
              auVar141._8_4_ = local_760._8_4_ * local_760._8_4_;
              auVar141._12_4_ = local_760._12_4_ * local_760._12_4_;
              auVar84 = vsubps_avx(local_680._0_16_,auVar141);
              fVar170 = auVar84._0_4_;
              auVar154._4_12_ = ZEXT812(0) << 0x20;
              auVar154._0_4_ = fVar170;
              auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar154);
              auVar87 = vmulss_avx512f(auVar80,ZEXT416(0x3fc00000));
              auVar81 = vmulss_avx512f(auVar84,ZEXT416(0xbf000000));
              uVar75 = fVar170 == 0.0;
              uVar74 = fVar170 < 0.0;
              if ((bool)uVar74) {
                local_620._0_4_ = auVar87._0_4_;
                local_640 = fVar166;
                fStack_63c = fVar166;
                fStack_638 = fVar166;
                fStack_634 = fVar166;
                local_630 = auVar80;
                fVar170 = sqrtf(fVar170);
                auVar81 = ZEXT416(auVar81._0_4_);
                auVar87 = ZEXT416((uint)local_620._0_4_);
                auVar85 = ZEXT416(auVar85._0_4_);
                auVar82 = ZEXT416((uint)local_6a0._0_4_);
                auVar86 = ZEXT416(auVar86._0_4_);
                auVar80 = local_630;
                fVar166 = local_640;
                fVar151 = fStack_63c;
                fVar172 = fStack_638;
                fVar174 = fStack_634;
              }
              else {
                auVar84 = vsqrtss_avx(auVar84,auVar84);
                fVar170 = auVar84._0_4_;
                fVar151 = fVar166;
                fVar172 = fVar166;
                fVar174 = fVar166;
              }
              auVar234 = ZEXT3264(local_8a0);
              auVar255 = ZEXT3264(local_8c0);
              auVar240 = ZEXT3264(local_7c0);
              auVar241 = ZEXT3264(local_7e0);
              auVar242 = ZEXT3264(local_8e0);
              auVar243 = ZEXT3264(local_900);
              auVar244 = ZEXT3264(local_920);
              auVar245 = ZEXT3264(local_800);
              auVar246 = ZEXT3264(local_940);
              auVar247 = ZEXT3264(local_820);
              auVar248 = ZEXT3264(local_960);
              auVar249 = ZEXT3264(local_840);
              auVar252 = ZEXT3264(local_980);
              auVar253 = ZEXT3264(local_9a0);
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_780._0_16_,
                                        local_4e0._0_16_);
              fVar204 = auVar84._0_4_ * 6.0;
              fVar152 = local_780._0_4_ * 6.0;
              auVar181._0_4_ = fVar152 * (float)local_5e0._0_4_;
              auVar181._4_4_ = fVar152 * (float)local_5e0._4_4_;
              auVar181._8_4_ = fVar152 * fStack_5d8;
              auVar181._12_4_ = fVar152 * fStack_5d4;
              auVar155._4_4_ = fVar204;
              auVar155._0_4_ = fVar204;
              auVar155._8_4_ = fVar204;
              auVar155._12_4_ = fVar204;
              auVar84 = vfmadd132ps_fma(auVar155,auVar181,local_5a0._0_16_);
              auVar250 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                         local_780._0_16_);
              fVar204 = auVar250._0_4_ * 6.0;
              auVar182._4_4_ = fVar204;
              auVar182._0_4_ = fVar204;
              auVar182._8_4_ = fVar204;
              auVar182._12_4_ = fVar204;
              auVar84 = vfmadd132ps_fma(auVar182,auVar84,local_5c0._0_16_);
              fVar204 = local_4e0._0_4_ * 6.0;
              auVar156._4_4_ = fVar204;
              auVar156._0_4_ = fVar204;
              auVar156._8_4_ = fVar204;
              auVar156._12_4_ = fVar204;
              auVar84 = vfmadd132ps_fma(auVar156,auVar84,local_580._0_16_);
              auVar183._0_4_ = auVar84._0_4_ * (float)local_500._0_4_;
              auVar183._4_4_ = auVar84._4_4_ * (float)local_500._0_4_;
              auVar183._8_4_ = auVar84._8_4_ * (float)local_500._0_4_;
              auVar183._12_4_ = auVar84._12_4_ * (float)local_500._0_4_;
              auVar84 = vdpps_avx(auVar83,auVar84,0x7f);
              fVar204 = auVar84._0_4_;
              auVar157._0_4_ = auVar83._0_4_ * fVar204;
              auVar157._4_4_ = auVar83._4_4_ * fVar204;
              auVar157._8_4_ = auVar83._8_4_ * fVar204;
              auVar157._12_4_ = auVar83._12_4_ * fVar204;
              auVar84 = vsubps_avx(auVar183,auVar157);
              fVar204 = (float)local_540._0_4_ * (float)local_520._0_4_;
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar88 = vxorps_avx512vl(auVar83,auVar22);
              auVar211._0_4_ = fVar166 * auVar84._0_4_ * fVar204;
              auVar211._4_4_ = fVar151 * auVar84._4_4_ * fVar204;
              auVar211._8_4_ = fVar172 * auVar84._8_4_ * fVar204;
              auVar211._12_4_ = fVar174 * auVar84._12_4_ * fVar204;
              auVar84 = vdpps_avx(auVar88,auVar140,0x7f);
              auVar250 = vmaxss_avx(ZEXT416((uint)fVar137),
                                    ZEXT416((uint)((float)local_7a0._0_4_ * fVar168 * 1.9073486e-06)
                                           ));
              auVar89 = vdivss_avx512f(ZEXT416((uint)fVar137),auVar85);
              auVar85 = vdpps_avx(local_740._0_16_,auVar211,0x7f);
              auVar82 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar137),auVar250);
              vfmadd213ss_avx512f(auVar86,auVar89,auVar82);
              auVar82 = vdpps_avx(local_710,auVar140,0x7f);
              fVar166 = auVar84._0_4_ + auVar85._0_4_;
              auVar85 = vdpps_avx(local_740._0_16_,auVar88,0x7f);
              auVar86 = vmulss_avx512f(auVar81,auVar80);
              auVar80 = vmulss_avx512f(auVar80,auVar80);
              auVar84 = vdpps_avx(local_740._0_16_,local_710,0x7f);
              auVar80 = vaddss_avx512f(auVar87,ZEXT416((uint)(auVar86._0_4_ * auVar80._0_4_)));
              auVar86 = vfnmadd231ss_avx512f(auVar85,local_760._0_16_,ZEXT416((uint)fVar166));
              auVar87 = vfnmadd231ss_avx512f(auVar84,local_760._0_16_,auVar82);
              auVar85 = vpermilps_avx(_local_4c0,0xff);
              fVar170 = fVar170 - auVar85._0_4_;
              auVar85 = vshufps_avx(auVar83,auVar83,0xff);
              auVar84 = vfmsub213ss_fma(auVar86,auVar80,auVar85);
              fVar151 = auVar87._0_4_ * auVar80._0_4_;
              auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar84._0_4_)),
                                        ZEXT416((uint)fVar166),ZEXT416((uint)fVar151));
              fVar172 = auVar80._0_4_;
              auVar225._0_4_ = fVar151 / fVar172;
              auVar225._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar218._0_4_ = auVar84._0_4_ / fVar172;
              auVar218._4_12_ = auVar84._4_12_;
              auVar84 = vmulss_avx512f(local_760._0_16_,auVar225);
              auVar80 = vmulss_avx512f(local_760._0_16_,auVar218);
              fVar151 = local_780._0_4_ - (auVar84._0_4_ - fVar170 * (auVar82._0_4_ / fVar172));
              auVar216 = ZEXT464((uint)fVar151);
              fVar166 = (float)local_7a0._0_4_ - (fVar170 * (fVar166 / fVar172) - auVar80._0_4_);
              uVar138 = 0;
              uVar235 = 0;
              uVar236 = 0;
              auVar23._8_4_ = 0x7fffffff;
              auVar23._0_8_ = 0x7fffffff7fffffff;
              auVar23._12_4_ = 0x7fffffff;
              auVar82 = vandps_avx512vl(local_760._0_16_,auVar23);
              auVar82 = vucomiss_avx512f(auVar82);
              if (!(bool)uVar74 && !(bool)uVar75) {
                auVar82 = vaddss_avx512f(auVar250,auVar82);
                auVar82 = vfmadd231ss_fma(auVar82,local_650,ZEXT416(0x36000000));
                auVar24._8_4_ = 0x7fffffff;
                auVar24._0_8_ = 0x7fffffff7fffffff;
                auVar24._12_4_ = 0x7fffffff;
                auVar84 = vandps_avx512vl(ZEXT416((uint)fVar170),auVar24);
                if (auVar84._0_4_ < auVar82._0_4_) {
                  fVar166 = fVar166 + (float)local_660._0_4_;
                  if ((((fVar166 < fVar205) ||
                       (fVar168 = *(float *)(ray + k * 4 + 0x80), fVar168 < fVar166)) ||
                      (fVar151 < 0.0)) || (1.0 < fVar151)) break;
                  auVar184._4_12_ = SUB1612(ZEXT816(0),0);
                  auVar184._0_4_ = local_680._0_4_;
                  auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar184);
                  fVar170 = auVar82._0_4_;
                  pGVar6 = (context->scene->geometries).items[uVar71].ptr;
                  if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                  fVar170 = fVar170 * 1.5 +
                            (float)local_680._0_4_ * -0.5 * fVar170 * fVar170 * fVar170;
                  auVar185._0_4_ = local_740._0_4_ * fVar170;
                  auVar185._4_4_ = local_740._4_4_ * fVar170;
                  auVar185._8_4_ = local_740._8_4_ * fVar170;
                  auVar185._12_4_ = local_740._12_4_ * fVar170;
                  auVar84 = vfmadd213ps_fma(auVar85,auVar185,auVar83);
                  auVar82 = vshufps_avx(auVar185,auVar185,0xc9);
                  auVar85 = vshufps_avx(auVar83,auVar83,0xc9);
                  auVar186._0_4_ = auVar185._0_4_ * auVar85._0_4_;
                  auVar186._4_4_ = auVar185._4_4_ * auVar85._4_4_;
                  auVar186._8_4_ = auVar185._8_4_ * auVar85._8_4_;
                  auVar186._12_4_ = auVar185._12_4_ * auVar85._12_4_;
                  auVar83 = vfmsub231ps_fma(auVar186,auVar83,auVar82);
                  auVar82 = vshufps_avx(auVar83,auVar83,0xc9);
                  auVar85 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar83 = vshufps_avx(auVar83,auVar83,0xd2);
                  auVar142._0_4_ = auVar84._0_4_ * auVar83._0_4_;
                  auVar142._4_4_ = auVar84._4_4_ * auVar83._4_4_;
                  auVar142._8_4_ = auVar84._8_4_ * auVar83._8_4_;
                  auVar142._12_4_ = auVar84._12_4_ * auVar83._12_4_;
                  auVar82 = vfmsub231ps_fma(auVar142,auVar82,auVar85);
                  uVar138 = auVar82._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar166;
                    uVar235 = vextractps_avx(auVar82,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar235;
                    uVar235 = vextractps_avx(auVar82,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar235;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar138;
                    *(float *)(ray + k * 4 + 0xf0) = fVar151;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_9b8;
                    *(uint *)(ray + k * 4 + 0x120) = uVar71;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_460 = (RTCHitN  [16])vshufps_avx(auVar82,auVar82,0x55);
                  auStack_450 = vshufps_avx(auVar82,auVar82,0xaa);
                  local_440 = uVar138;
                  uStack_43c = uVar138;
                  uStack_438 = uVar138;
                  uStack_434 = uVar138;
                  local_430 = fVar151;
                  fStack_42c = fVar151;
                  fStack_428 = fVar151;
                  fStack_424 = fVar151;
                  local_420 = ZEXT416(0) << 0x20;
                  local_410 = local_480._0_8_;
                  uStack_408 = local_480._8_8_;
                  local_400 = local_470;
                  vpcmpeqd_avx2(ZEXT1632(local_470),ZEXT1632(local_470));
                  uStack_3ec = context->user->instID[0];
                  local_3f0 = uStack_3ec;
                  uStack_3e8 = uStack_3ec;
                  uStack_3e4 = uStack_3ec;
                  uStack_3e0 = context->user->instPrimID[0];
                  uStack_3dc = uStack_3e0;
                  uStack_3d8 = uStack_3e0;
                  uStack_3d4 = uStack_3e0;
                  *(float *)(ray + k * 4 + 0x80) = fVar166;
                  local_9d0 = local_490;
                  local_870.valid = (int *)local_9d0;
                  local_870.geometryUserPtr = pGVar6->userPtr;
                  local_870.context = context->user;
                  local_870.hit = local_460;
                  local_870.N = 4;
                  local_870.ray = (RTCRayN *)ray;
                  if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar6->intersectionFilterN)(&local_870);
                    auVar253 = ZEXT3264(local_9a0);
                    auVar252 = ZEXT3264(local_980);
                    auVar249 = ZEXT3264(local_840);
                    auVar248 = ZEXT3264(local_960);
                    auVar247 = ZEXT3264(local_820);
                    auVar246 = ZEXT3264(local_940);
                    auVar245 = ZEXT3264(local_800);
                    auVar244 = ZEXT3264(local_920);
                    auVar243 = ZEXT3264(local_900);
                    auVar242 = ZEXT3264(local_8e0);
                    auVar241 = ZEXT3264(local_7e0);
                    auVar240 = ZEXT3264(local_7c0);
                    auVar255 = ZEXT3264(local_8c0);
                    auVar234 = ZEXT3264(local_8a0);
                  }
                  uVar70 = vptestmd_avx512vl(local_9d0,local_9d0);
                  if ((uVar70 & 0xf) != 0) {
                    p_Var7 = context->args->filter;
                    if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var7)(&local_870);
                      auVar253 = ZEXT3264(local_9a0);
                      auVar252 = ZEXT3264(local_980);
                      auVar249 = ZEXT3264(local_840);
                      auVar248 = ZEXT3264(local_960);
                      auVar247 = ZEXT3264(local_820);
                      auVar246 = ZEXT3264(local_940);
                      auVar245 = ZEXT3264(local_800);
                      auVar244 = ZEXT3264(local_920);
                      auVar243 = ZEXT3264(local_900);
                      auVar242 = ZEXT3264(local_8e0);
                      auVar241 = ZEXT3264(local_7e0);
                      auVar240 = ZEXT3264(local_7c0);
                      auVar255 = ZEXT3264(local_8c0);
                      auVar234 = ZEXT3264(local_8a0);
                    }
                    uVar70 = vptestmd_avx512vl(local_9d0,local_9d0);
                    uVar70 = uVar70 & 0xf;
                    bVar76 = (byte)uVar70;
                    if (bVar76 != 0) {
                      iVar3 = *(int *)(local_870.hit + 4);
                      iVar4 = *(int *)(local_870.hit + 8);
                      iVar1 = *(int *)(local_870.hit + 0xc);
                      bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar70 >> 2) & 1);
                      bVar10 = SUB81(uVar70 >> 3,0);
                      *(uint *)(local_870.ray + 0xc0) =
                           (uint)(bVar76 & 1) * *(int *)local_870.hit |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_870.ray + 0xc0);
                      *(uint *)(local_870.ray + 0xc4) =
                           (uint)bVar8 * iVar3 | (uint)!bVar8 * *(int *)(local_870.ray + 0xc4);
                      *(uint *)(local_870.ray + 200) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_870.ray + 200);
                      *(uint *)(local_870.ray + 0xcc) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_870.ray + 0xcc);
                      iVar3 = *(int *)(local_870.hit + 0x14);
                      iVar4 = *(int *)(local_870.hit + 0x18);
                      iVar1 = *(int *)(local_870.hit + 0x1c);
                      bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar70 >> 2) & 1);
                      bVar10 = SUB81(uVar70 >> 3,0);
                      *(uint *)(local_870.ray + 0xd0) =
                           (uint)(bVar76 & 1) * *(int *)(local_870.hit + 0x10) |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_870.ray + 0xd0);
                      *(uint *)(local_870.ray + 0xd4) =
                           (uint)bVar8 * iVar3 | (uint)!bVar8 * *(int *)(local_870.ray + 0xd4);
                      *(uint *)(local_870.ray + 0xd8) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_870.ray + 0xd8);
                      *(uint *)(local_870.ray + 0xdc) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_870.ray + 0xdc);
                      iVar3 = *(int *)(local_870.hit + 0x24);
                      iVar4 = *(int *)(local_870.hit + 0x28);
                      iVar1 = *(int *)(local_870.hit + 0x2c);
                      bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar70 >> 2) & 1);
                      bVar10 = SUB81(uVar70 >> 3,0);
                      *(uint *)(local_870.ray + 0xe0) =
                           (uint)(bVar76 & 1) * *(int *)(local_870.hit + 0x20) |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_870.ray + 0xe0);
                      *(uint *)(local_870.ray + 0xe4) =
                           (uint)bVar8 * iVar3 | (uint)!bVar8 * *(int *)(local_870.ray + 0xe4);
                      *(uint *)(local_870.ray + 0xe8) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_870.ray + 0xe8);
                      *(uint *)(local_870.ray + 0xec) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_870.ray + 0xec);
                      iVar3 = *(int *)(local_870.hit + 0x34);
                      iVar4 = *(int *)(local_870.hit + 0x38);
                      iVar1 = *(int *)(local_870.hit + 0x3c);
                      bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar70 >> 2) & 1);
                      bVar10 = SUB81(uVar70 >> 3,0);
                      *(uint *)(local_870.ray + 0xf0) =
                           (uint)(bVar76 & 1) * *(int *)(local_870.hit + 0x30) |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_870.ray + 0xf0);
                      *(uint *)(local_870.ray + 0xf4) =
                           (uint)bVar8 * iVar3 | (uint)!bVar8 * *(int *)(local_870.ray + 0xf4);
                      *(uint *)(local_870.ray + 0xf8) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_870.ray + 0xf8);
                      *(uint *)(local_870.ray + 0xfc) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_870.ray + 0xfc);
                      iVar3 = *(int *)(local_870.hit + 0x44);
                      iVar4 = *(int *)(local_870.hit + 0x48);
                      iVar1 = *(int *)(local_870.hit + 0x4c);
                      bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar70 >> 2) & 1);
                      bVar10 = SUB81(uVar70 >> 3,0);
                      *(uint *)(local_870.ray + 0x100) =
                           (uint)(bVar76 & 1) * *(int *)(local_870.hit + 0x40) |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_870.ray + 0x100);
                      *(uint *)(local_870.ray + 0x104) =
                           (uint)bVar8 * iVar3 | (uint)!bVar8 * *(int *)(local_870.ray + 0x104);
                      *(uint *)(local_870.ray + 0x108) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_870.ray + 0x108);
                      *(uint *)(local_870.ray + 0x10c) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_870.ray + 0x10c);
                      auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x50));
                      *(undefined1 (*) [16])(local_870.ray + 0x110) = auVar82;
                      auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x60));
                      *(undefined1 (*) [16])(local_870.ray + 0x120) = auVar82;
                      auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x70));
                      *(undefined1 (*) [16])(local_870.ray + 0x130) = auVar82;
                      auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x80));
                      *(undefined1 (*) [16])(local_870.ray + 0x140) = auVar82;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar168;
                  break;
                }
              }
              lVar72 = lVar72 + -1;
            } while (lVar72 != 0);
            uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar149._4_4_ = uVar138;
            auVar149._0_4_ = uVar138;
            auVar149._8_4_ = uVar138;
            auVar149._12_4_ = uVar138;
            auVar149._16_4_ = uVar138;
            auVar149._20_4_ = uVar138;
            auVar149._24_4_ = uVar138;
            auVar149._28_4_ = uVar138;
            auVar61._4_4_ = fStack_35c;
            auVar61._0_4_ = local_360;
            auVar61._8_4_ = fStack_358;
            auVar61._12_4_ = fStack_354;
            auVar61._16_4_ = fStack_350;
            auVar61._20_4_ = fStack_34c;
            auVar61._24_4_ = fStack_348;
            auVar61._28_4_ = fStack_344;
            uVar16 = vcmpps_avx512vl(auVar149,auVar61,0xd);
            bVar73 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar73 & (byte)uVar16;
          } while (bVar73 != 0);
          auVar251 = ZEXT3264(local_700);
          uVar77 = (ulong)local_9ac;
          auVar93 = local_2c0;
        }
        bVar73 = local_380[0] | (byte)uVar77;
        auVar164._0_4_ = (float)local_6c0._0_4_ + auVar93._0_4_;
        auVar164._4_4_ = (float)local_6c0._4_4_ + auVar93._4_4_;
        auVar164._8_4_ = fStack_6b8 + auVar93._8_4_;
        auVar164._12_4_ = fStack_6b4 + auVar93._12_4_;
        auVar164._16_4_ = fStack_6b0 + auVar93._16_4_;
        auVar164._20_4_ = fStack_6ac + auVar93._20_4_;
        auVar164._24_4_ = fStack_6a8 + auVar93._24_4_;
        auVar164._28_4_ = fStack_6a4 + auVar93._28_4_;
        uVar16 = vcmpps_avx512vl(auVar164,auVar149,2);
        bVar65 = (byte)uVar18 & bVar65 & (byte)uVar16;
        auVar165._8_4_ = 2;
        auVar165._0_8_ = 0x200000002;
        auVar165._12_4_ = 2;
        auVar165._16_4_ = 2;
        auVar165._20_4_ = 2;
        auVar165._24_4_ = 2;
        auVar165._28_4_ = 2;
        auVar39._8_4_ = 3;
        auVar39._0_8_ = 0x300000003;
        auVar39._12_4_ = 3;
        auVar39._16_4_ = 3;
        auVar39._20_4_ = 3;
        auVar39._24_4_ = 3;
        auVar39._28_4_ = 3;
        auVar95 = vpblendmd_avx512vl(auVar165,auVar39);
        auVar127._0_4_ = (uint)(bVar73 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar73 & 1) * 2;
        bVar8 = (bool)(bVar73 >> 1 & 1);
        auVar127._4_4_ = (uint)bVar8 * auVar95._4_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar73 >> 2 & 1);
        auVar127._8_4_ = (uint)bVar8 * auVar95._8_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar73 >> 3 & 1);
        auVar127._12_4_ = (uint)bVar8 * auVar95._12_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar73 >> 4 & 1);
        auVar127._16_4_ = (uint)bVar8 * auVar95._16_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar73 >> 5 & 1);
        auVar127._20_4_ = (uint)bVar8 * auVar95._20_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar73 >> 6 & 1);
        auVar127._24_4_ = (uint)bVar8 * auVar95._24_4_ | (uint)!bVar8 * 2;
        auVar127._28_4_ = (uint)(bVar73 >> 7) * auVar95._28_4_ | (uint)!(bool)(bVar73 >> 7) * 2;
        uVar16 = vpcmpd_avx512vl(local_320,auVar127,5);
        bVar73 = (byte)uVar16 & bVar65;
        fVar137 = (float)local_6c0._0_4_;
        fVar166 = (float)local_6c0._4_4_;
        fVar168 = fStack_6b8;
        fVar170 = fStack_6b4;
        fVar151 = fStack_6b0;
        fVar172 = fStack_6ac;
        fVar174 = fStack_6a8;
        fVar204 = fStack_6a4;
        if (bVar73 != 0) {
          local_380 = auVar127;
          auVar85 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar82 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar83 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar84 = vminps_avx(auVar85,auVar83);
          auVar85 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar83 = vmaxps_avx(auVar82,auVar85);
          auVar187._8_4_ = 0x7fffffff;
          auVar187._0_8_ = 0x7fffffff7fffffff;
          auVar187._12_4_ = 0x7fffffff;
          auVar82 = vandps_avx(auVar84,auVar187);
          auVar85 = vandps_avx(auVar83,auVar187);
          auVar82 = vmaxps_avx(auVar82,auVar85);
          auVar85 = vmovshdup_avx(auVar82);
          auVar85 = vmaxss_avx(auVar85,auVar82);
          auVar82 = vshufpd_avx(auVar82,auVar82,1);
          auVar82 = vmaxss_avx(auVar82,auVar85);
          fVar137 = auVar82._0_4_ * 1.9073486e-06;
          local_650 = vshufps_avx(auVar83,auVar83,0xff);
          local_360 = (float)local_6c0._0_4_ + local_300._0_4_;
          fStack_35c = (float)local_6c0._4_4_ + local_300._4_4_;
          fStack_358 = fStack_6b8 + local_300._8_4_;
          fStack_354 = fStack_6b4 + local_300._12_4_;
          fStack_350 = fStack_6b0 + local_300._16_4_;
          fStack_34c = fStack_6ac + local_300._20_4_;
          fStack_348 = fStack_6a8 + local_300._24_4_;
          fStack_344 = fStack_6a4 + local_300._28_4_;
          _local_600 = local_300;
          do {
            auVar150._8_4_ = 0x7f800000;
            auVar150._0_8_ = 0x7f8000007f800000;
            auVar150._12_4_ = 0x7f800000;
            auVar150._16_4_ = 0x7f800000;
            auVar150._20_4_ = 0x7f800000;
            auVar150._24_4_ = 0x7f800000;
            auVar150._28_4_ = 0x7f800000;
            auVar95 = vblendmps_avx512vl(auVar150,_local_600);
            auVar128._0_4_ =
                 (uint)(bVar73 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar73 & 1) * 0x7f800000;
            bVar8 = (bool)(bVar73 >> 1 & 1);
            auVar128._4_4_ = (uint)bVar8 * auVar95._4_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar73 >> 2 & 1);
            auVar128._8_4_ = (uint)bVar8 * auVar95._8_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar73 >> 3 & 1);
            auVar128._12_4_ = (uint)bVar8 * auVar95._12_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar73 >> 4 & 1);
            auVar128._16_4_ = (uint)bVar8 * auVar95._16_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar73 >> 5 & 1);
            auVar128._20_4_ = (uint)bVar8 * auVar95._20_4_ | (uint)!bVar8 * 0x7f800000;
            auVar128._24_4_ =
                 (uint)(bVar73 >> 6) * auVar95._24_4_ | (uint)!(bool)(bVar73 >> 6) * 0x7f800000;
            auVar128._28_4_ = 0x7f800000;
            auVar95 = vshufps_avx(auVar128,auVar128,0xb1);
            auVar95 = vminps_avx(auVar128,auVar95);
            auVar93 = vshufpd_avx(auVar95,auVar95,5);
            auVar95 = vminps_avx(auVar95,auVar93);
            auVar93 = vpermpd_avx2(auVar95,0x4e);
            auVar95 = vminps_avx(auVar95,auVar93);
            uVar16 = vcmpps_avx512vl(auVar128,auVar95,0);
            bVar66 = (byte)uVar16 & bVar73;
            bVar76 = bVar73;
            if (bVar66 != 0) {
              bVar76 = bVar66;
            }
            iVar2 = 0;
            for (uVar79 = (uint)bVar76; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            auVar216 = ZEXT464(*(uint *)(local_1c0 + (uint)(iVar2 << 2)));
            fVar168 = local_9a4;
            fVar166 = *(float *)(local_2e0 + (uint)(iVar2 << 2));
            uVar138 = 0;
            uVar235 = 0;
            uVar236 = 0;
            if ((float)local_720._0_4_ < 0.0) {
              local_780._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar2 << 2)));
              local_7a0._0_16_ = ZEXT416((uint)*(float *)(local_2e0 + (uint)(iVar2 << 2)));
              fVar168 = sqrtf((float)local_720._0_4_);
              auVar216 = ZEXT1664(local_780._0_16_);
              fVar166 = (float)local_7a0._0_4_;
              uVar138 = local_7a0._4_4_;
              uVar235 = local_7a0._8_4_;
              uVar236 = local_7a0._12_4_;
            }
            lVar72 = 5;
            do {
              auVar95 = local_7a0;
              auVar143._4_4_ = fVar166;
              auVar143._0_4_ = fVar166;
              auVar143._8_4_ = fVar166;
              auVar143._12_4_ = fVar166;
              auVar85 = vfmadd132ps_fma(auVar143,ZEXT816(0) << 0x40,local_710);
              fVar151 = auVar216._0_4_;
              fVar170 = 1.0 - fVar151;
              auVar188._0_4_ = local_5c0._0_4_ * fVar151;
              auVar188._4_4_ = local_5c0._4_4_ * fVar151;
              auVar188._8_4_ = local_5c0._8_4_ * fVar151;
              auVar188._12_4_ = local_5c0._12_4_ * fVar151;
              local_4e0._0_16_ = ZEXT416((uint)fVar170);
              auVar207._4_4_ = fVar170;
              auVar207._0_4_ = fVar170;
              auVar207._8_4_ = fVar170;
              auVar207._12_4_ = fVar170;
              auVar82 = vfmadd231ps_fma(auVar188,auVar207,local_580._0_16_);
              auVar212._0_4_ = local_5a0._0_4_ * fVar151;
              auVar212._4_4_ = local_5a0._4_4_ * fVar151;
              auVar212._8_4_ = local_5a0._8_4_ * fVar151;
              auVar212._12_4_ = local_5a0._12_4_ * fVar151;
              auVar83 = vfmadd231ps_fma(auVar212,auVar207,local_5c0._0_16_);
              auVar219._0_4_ = fVar151 * (float)local_5e0._0_4_;
              auVar219._4_4_ = fVar151 * (float)local_5e0._4_4_;
              auVar219._8_4_ = fVar151 * fStack_5d8;
              auVar219._12_4_ = fVar151 * fStack_5d4;
              auVar84 = vfmadd231ps_fma(auVar219,auVar207,local_5a0._0_16_);
              auVar226._0_4_ = fVar151 * auVar83._0_4_;
              auVar226._4_4_ = fVar151 * auVar83._4_4_;
              auVar226._8_4_ = fVar151 * auVar83._8_4_;
              auVar226._12_4_ = fVar151 * auVar83._12_4_;
              auVar82 = vfmadd231ps_fma(auVar226,auVar207,auVar82);
              auVar189._0_4_ = fVar151 * auVar84._0_4_;
              auVar189._4_4_ = fVar151 * auVar84._4_4_;
              auVar189._8_4_ = fVar151 * auVar84._8_4_;
              auVar189._12_4_ = fVar151 * auVar84._12_4_;
              auVar83 = vfmadd231ps_fma(auVar189,auVar207,auVar83);
              auVar213._0_4_ = fVar151 * auVar83._0_4_;
              auVar213._4_4_ = fVar151 * auVar83._4_4_;
              auVar213._8_4_ = fVar151 * auVar83._8_4_;
              auVar213._12_4_ = fVar151 * auVar83._12_4_;
              auVar84 = vfmadd231ps_fma(auVar213,auVar82,auVar207);
              auVar82 = vsubps_avx(auVar83,auVar82);
              auVar25._8_4_ = 0x40400000;
              auVar25._0_8_ = 0x4040000040400000;
              auVar25._12_4_ = 0x40400000;
              auVar83 = vmulps_avx512vl(auVar82,auVar25);
              _local_4c0 = auVar84;
              auVar82 = vsubps_avx(auVar85,auVar84);
              local_740._0_16_ = auVar82;
              auVar82 = vdpps_avx(auVar82,auVar82,0x7f);
              local_680._0_16_ = auVar82;
              local_780._0_16_ = auVar216._0_16_;
              local_7a0._4_4_ = uVar138;
              local_7a0._0_4_ = fVar166;
              local_7a0._8_4_ = uVar235;
              local_7a0._16_16_ = auVar95._16_16_;
              local_7a0._12_4_ = uVar236;
              if (auVar82._0_4_ < 0.0) {
                auVar234._0_4_ = sqrtf(auVar82._0_4_);
                auVar234._4_60_ = extraout_var_01;
                auVar82 = auVar234._0_16_;
              }
              else {
                auVar82 = vsqrtss_avx(auVar82,auVar82);
              }
              local_500._0_16_ = vdpps_avx(auVar83,auVar83,0x7f);
              fVar166 = local_500._0_4_;
              auVar190._4_12_ = ZEXT812(0) << 0x20;
              auVar190._0_4_ = fVar166;
              local_760._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
              fVar170 = local_760._0_4_;
              local_520._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar84 = vxorps_avx512vl(local_500._0_16_,auVar26);
              auVar85 = vfnmadd213ss_fma(local_520._0_16_,local_500._0_16_,ZEXT416(0x40000000));
              local_540._0_4_ = auVar85._0_4_;
              local_6a0._0_4_ = auVar82._0_4_;
              if (fVar166 < auVar84._0_4_) {
                auVar240._0_4_ = sqrtf(fVar166);
                auVar240._4_60_ = extraout_var_02;
                auVar82 = ZEXT416((uint)local_6a0._0_4_);
                auVar85 = auVar240._0_16_;
              }
              else {
                auVar85 = vsqrtss_avx512f(local_500._0_16_,local_500._0_16_);
              }
              fVar151 = local_760._0_4_;
              fVar166 = fVar170 * 1.5 + fVar166 * -0.5 * fVar151 * fVar151 * fVar151;
              auVar237._0_4_ = auVar83._0_4_ * fVar166;
              auVar237._4_4_ = auVar83._4_4_ * fVar166;
              auVar237._8_4_ = auVar83._8_4_ * fVar166;
              auVar237._12_4_ = auVar83._12_4_ * fVar166;
              local_760._0_16_ = vdpps_avx(local_740._0_16_,auVar237,0x7f);
              auVar86 = vaddss_avx512f(auVar82,ZEXT416(0x3f800000));
              auVar144._0_4_ = local_760._0_4_ * local_760._0_4_;
              auVar144._4_4_ = local_760._4_4_ * local_760._4_4_;
              auVar144._8_4_ = local_760._8_4_ * local_760._8_4_;
              auVar144._12_4_ = local_760._12_4_ * local_760._12_4_;
              auVar84 = vsubps_avx(local_680._0_16_,auVar144);
              fVar170 = auVar84._0_4_;
              auVar158._4_12_ = ZEXT812(0) << 0x20;
              auVar158._0_4_ = fVar170;
              auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar158);
              auVar87 = vmulss_avx512f(auVar80,ZEXT416(0x3fc00000));
              auVar81 = vmulss_avx512f(auVar84,ZEXT416(0xbf000000));
              uVar75 = fVar170 == 0.0;
              uVar74 = fVar170 < 0.0;
              if ((bool)uVar74) {
                local_640 = fVar166;
                fStack_63c = fVar166;
                fStack_638 = fVar166;
                fStack_634 = fVar166;
                local_630 = auVar237;
                local_620 = auVar80;
                fVar170 = sqrtf(fVar170);
                auVar81 = ZEXT416(auVar81._0_4_);
                auVar87 = ZEXT416(auVar87._0_4_);
                auVar85 = ZEXT416(auVar85._0_4_);
                auVar82 = ZEXT416((uint)local_6a0._0_4_);
                auVar86 = ZEXT416(auVar86._0_4_);
                auVar237 = local_630;
                auVar80 = local_620;
                fVar166 = local_640;
                fVar151 = fStack_63c;
                fVar172 = fStack_638;
                fVar174 = fStack_634;
              }
              else {
                auVar84 = vsqrtss_avx(auVar84,auVar84);
                fVar170 = auVar84._0_4_;
                fVar151 = fVar166;
                fVar172 = fVar166;
                fVar174 = fVar166;
              }
              auVar234 = ZEXT3264(local_8a0);
              auVar255 = ZEXT3264(local_8c0);
              auVar240 = ZEXT3264(local_7c0);
              auVar241 = ZEXT3264(local_7e0);
              auVar242 = ZEXT3264(local_8e0);
              auVar243 = ZEXT3264(local_900);
              auVar244 = ZEXT3264(local_920);
              auVar245 = ZEXT3264(local_800);
              auVar246 = ZEXT3264(local_940);
              auVar247 = ZEXT3264(local_820);
              auVar248 = ZEXT3264(local_960);
              auVar249 = ZEXT3264(local_840);
              auVar252 = ZEXT3264(local_980);
              auVar253 = ZEXT3264(local_9a0);
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_780._0_16_,
                                        local_4e0._0_16_);
              fVar204 = auVar84._0_4_ * 6.0;
              fVar152 = local_780._0_4_ * 6.0;
              auVar191._0_4_ = fVar152 * (float)local_5e0._0_4_;
              auVar191._4_4_ = fVar152 * (float)local_5e0._4_4_;
              auVar191._8_4_ = fVar152 * fStack_5d8;
              auVar191._12_4_ = fVar152 * fStack_5d4;
              auVar159._4_4_ = fVar204;
              auVar159._0_4_ = fVar204;
              auVar159._8_4_ = fVar204;
              auVar159._12_4_ = fVar204;
              auVar84 = vfmadd132ps_fma(auVar159,auVar191,local_5a0._0_16_);
              auVar250 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                         local_780._0_16_);
              fVar204 = auVar250._0_4_ * 6.0;
              auVar192._4_4_ = fVar204;
              auVar192._0_4_ = fVar204;
              auVar192._8_4_ = fVar204;
              auVar192._12_4_ = fVar204;
              auVar84 = vfmadd132ps_fma(auVar192,auVar84,local_5c0._0_16_);
              fVar204 = local_4e0._0_4_ * 6.0;
              auVar160._4_4_ = fVar204;
              auVar160._0_4_ = fVar204;
              auVar160._8_4_ = fVar204;
              auVar160._12_4_ = fVar204;
              auVar84 = vfmadd132ps_fma(auVar160,auVar84,local_580._0_16_);
              auVar193._0_4_ = auVar84._0_4_ * (float)local_500._0_4_;
              auVar193._4_4_ = auVar84._4_4_ * (float)local_500._0_4_;
              auVar193._8_4_ = auVar84._8_4_ * (float)local_500._0_4_;
              auVar193._12_4_ = auVar84._12_4_ * (float)local_500._0_4_;
              auVar84 = vdpps_avx(auVar83,auVar84,0x7f);
              fVar204 = auVar84._0_4_;
              auVar161._0_4_ = auVar83._0_4_ * fVar204;
              auVar161._4_4_ = auVar83._4_4_ * fVar204;
              auVar161._8_4_ = auVar83._8_4_ * fVar204;
              auVar161._12_4_ = auVar83._12_4_ * fVar204;
              auVar84 = vsubps_avx(auVar193,auVar161);
              fVar204 = (float)local_540._0_4_ * (float)local_520._0_4_;
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar88 = vxorps_avx512vl(auVar83,auVar27);
              auVar214._0_4_ = fVar166 * auVar84._0_4_ * fVar204;
              auVar214._4_4_ = fVar151 * auVar84._4_4_ * fVar204;
              auVar214._8_4_ = fVar172 * auVar84._8_4_ * fVar204;
              auVar214._12_4_ = fVar174 * auVar84._12_4_ * fVar204;
              auVar84 = vdpps_avx(auVar88,auVar237,0x7f);
              auVar250 = vmaxss_avx(ZEXT416((uint)fVar137),
                                    ZEXT416((uint)((float)local_7a0._0_4_ * fVar168 * 1.9073486e-06)
                                           ));
              auVar89 = vdivss_avx512f(ZEXT416((uint)fVar137),auVar85);
              auVar85 = vdpps_avx(local_740._0_16_,auVar214,0x7f);
              auVar82 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar137),auVar250);
              vfmadd213ss_avx512f(auVar86,auVar89,auVar82);
              auVar82 = vdpps_avx(local_710,auVar237,0x7f);
              fVar166 = auVar84._0_4_ + auVar85._0_4_;
              auVar85 = vdpps_avx(local_740._0_16_,auVar88,0x7f);
              auVar86 = vmulss_avx512f(auVar81,auVar80);
              auVar80 = vmulss_avx512f(auVar80,auVar80);
              auVar84 = vdpps_avx(local_740._0_16_,local_710,0x7f);
              auVar80 = vaddss_avx512f(auVar87,ZEXT416((uint)(auVar86._0_4_ * auVar80._0_4_)));
              auVar86 = vfnmadd231ss_avx512f(auVar85,local_760._0_16_,ZEXT416((uint)fVar166));
              auVar87 = vfnmadd231ss_avx512f(auVar84,local_760._0_16_,auVar82);
              auVar85 = vpermilps_avx(_local_4c0,0xff);
              fVar170 = fVar170 - auVar85._0_4_;
              auVar85 = vshufps_avx(auVar83,auVar83,0xff);
              auVar84 = vfmsub213ss_fma(auVar86,auVar80,auVar85);
              fVar151 = auVar87._0_4_ * auVar80._0_4_;
              auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar84._0_4_)),
                                        ZEXT416((uint)fVar166),ZEXT416((uint)fVar151));
              fVar172 = auVar80._0_4_;
              auVar227._0_4_ = fVar151 / fVar172;
              auVar227._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar220._0_4_ = auVar84._0_4_ / fVar172;
              auVar220._4_12_ = auVar84._4_12_;
              auVar84 = vmulss_avx512f(local_760._0_16_,auVar227);
              auVar80 = vmulss_avx512f(local_760._0_16_,auVar220);
              fVar151 = local_780._0_4_ - (auVar84._0_4_ - fVar170 * (auVar82._0_4_ / fVar172));
              auVar216 = ZEXT464((uint)fVar151);
              fVar166 = (float)local_7a0._0_4_ - (fVar170 * (fVar166 / fVar172) - auVar80._0_4_);
              uVar138 = 0;
              uVar235 = 0;
              uVar236 = 0;
              auVar28._8_4_ = 0x7fffffff;
              auVar28._0_8_ = 0x7fffffff7fffffff;
              auVar28._12_4_ = 0x7fffffff;
              auVar82 = vandps_avx512vl(local_760._0_16_,auVar28);
              auVar82 = vucomiss_avx512f(auVar82);
              if (!(bool)uVar74 && !(bool)uVar75) {
                auVar82 = vaddss_avx512f(auVar250,auVar82);
                auVar82 = vfmadd231ss_fma(auVar82,local_650,ZEXT416(0x36000000));
                auVar29._8_4_ = 0x7fffffff;
                auVar29._0_8_ = 0x7fffffff7fffffff;
                auVar29._12_4_ = 0x7fffffff;
                auVar84 = vandps_avx512vl(ZEXT416((uint)fVar170),auVar29);
                if (auVar84._0_4_ < auVar82._0_4_) {
                  fVar166 = fVar166 + (float)local_660._0_4_;
                  if ((((fVar166 < fVar205) ||
                       (fVar168 = *(float *)(ray + k * 4 + 0x80), fVar168 < fVar166)) ||
                      (fVar151 < 0.0)) || (1.0 < fVar151)) break;
                  auVar194._4_12_ = SUB1612(ZEXT816(0),0);
                  auVar194._0_4_ = local_680._0_4_;
                  auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar194);
                  fVar170 = auVar82._0_4_;
                  pGVar6 = (context->scene->geometries).items[uVar71].ptr;
                  if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                  fVar170 = fVar170 * 1.5 +
                            (float)local_680._0_4_ * -0.5 * fVar170 * fVar170 * fVar170;
                  auVar195._0_4_ = local_740._0_4_ * fVar170;
                  auVar195._4_4_ = local_740._4_4_ * fVar170;
                  auVar195._8_4_ = local_740._8_4_ * fVar170;
                  auVar195._12_4_ = local_740._12_4_ * fVar170;
                  auVar84 = vfmadd213ps_fma(auVar85,auVar195,auVar83);
                  auVar82 = vshufps_avx(auVar195,auVar195,0xc9);
                  auVar85 = vshufps_avx(auVar83,auVar83,0xc9);
                  auVar196._0_4_ = auVar195._0_4_ * auVar85._0_4_;
                  auVar196._4_4_ = auVar195._4_4_ * auVar85._4_4_;
                  auVar196._8_4_ = auVar195._8_4_ * auVar85._8_4_;
                  auVar196._12_4_ = auVar195._12_4_ * auVar85._12_4_;
                  auVar83 = vfmsub231ps_fma(auVar196,auVar83,auVar82);
                  auVar82 = vshufps_avx(auVar83,auVar83,0xc9);
                  auVar85 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar83 = vshufps_avx(auVar83,auVar83,0xd2);
                  auVar145._0_4_ = auVar84._0_4_ * auVar83._0_4_;
                  auVar145._4_4_ = auVar84._4_4_ * auVar83._4_4_;
                  auVar145._8_4_ = auVar84._8_4_ * auVar83._8_4_;
                  auVar145._12_4_ = auVar84._12_4_ * auVar83._12_4_;
                  auVar82 = vfmsub231ps_fma(auVar145,auVar82,auVar85);
                  uVar138 = auVar82._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar166;
                    uVar235 = vextractps_avx(auVar82,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar235;
                    uVar235 = vextractps_avx(auVar82,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar235;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar138;
                    *(float *)(ray + k * 4 + 0xf0) = fVar151;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_9b8;
                    *(uint *)(ray + k * 4 + 0x120) = uVar71;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_460 = (RTCHitN  [16])vshufps_avx(auVar82,auVar82,0x55);
                  auStack_450 = vshufps_avx(auVar82,auVar82,0xaa);
                  local_440 = uVar138;
                  uStack_43c = uVar138;
                  uStack_438 = uVar138;
                  uStack_434 = uVar138;
                  local_430 = fVar151;
                  fStack_42c = fVar151;
                  fStack_428 = fVar151;
                  fStack_424 = fVar151;
                  local_420 = ZEXT416(0) << 0x20;
                  local_410 = local_480._0_8_;
                  uStack_408 = local_480._8_8_;
                  local_400 = local_470;
                  vpcmpeqd_avx2(ZEXT1632(local_470),ZEXT1632(local_470));
                  uStack_3ec = context->user->instID[0];
                  local_3f0 = uStack_3ec;
                  uStack_3e8 = uStack_3ec;
                  uStack_3e4 = uStack_3ec;
                  uStack_3e0 = context->user->instPrimID[0];
                  uStack_3dc = uStack_3e0;
                  uStack_3d8 = uStack_3e0;
                  uStack_3d4 = uStack_3e0;
                  *(float *)(ray + k * 4 + 0x80) = fVar166;
                  local_9d0 = local_490;
                  local_870.valid = (int *)local_9d0;
                  local_870.geometryUserPtr = pGVar6->userPtr;
                  local_870.context = context->user;
                  local_870.hit = local_460;
                  local_870.N = 4;
                  local_870.ray = (RTCRayN *)ray;
                  if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar6->intersectionFilterN)(&local_870);
                    auVar253 = ZEXT3264(local_9a0);
                    auVar252 = ZEXT3264(local_980);
                    auVar249 = ZEXT3264(local_840);
                    auVar248 = ZEXT3264(local_960);
                    auVar247 = ZEXT3264(local_820);
                    auVar246 = ZEXT3264(local_940);
                    auVar245 = ZEXT3264(local_800);
                    auVar244 = ZEXT3264(local_920);
                    auVar243 = ZEXT3264(local_900);
                    auVar242 = ZEXT3264(local_8e0);
                    auVar241 = ZEXT3264(local_7e0);
                    auVar240 = ZEXT3264(local_7c0);
                    auVar255 = ZEXT3264(local_8c0);
                    auVar234 = ZEXT3264(local_8a0);
                  }
                  uVar70 = vptestmd_avx512vl(local_9d0,local_9d0);
                  if ((uVar70 & 0xf) != 0) {
                    p_Var7 = context->args->filter;
                    if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var7)(&local_870);
                      auVar253 = ZEXT3264(local_9a0);
                      auVar252 = ZEXT3264(local_980);
                      auVar249 = ZEXT3264(local_840);
                      auVar248 = ZEXT3264(local_960);
                      auVar247 = ZEXT3264(local_820);
                      auVar246 = ZEXT3264(local_940);
                      auVar245 = ZEXT3264(local_800);
                      auVar244 = ZEXT3264(local_920);
                      auVar243 = ZEXT3264(local_900);
                      auVar242 = ZEXT3264(local_8e0);
                      auVar241 = ZEXT3264(local_7e0);
                      auVar240 = ZEXT3264(local_7c0);
                      auVar255 = ZEXT3264(local_8c0);
                      auVar234 = ZEXT3264(local_8a0);
                    }
                    uVar70 = vptestmd_avx512vl(local_9d0,local_9d0);
                    uVar70 = uVar70 & 0xf;
                    bVar76 = (byte)uVar70;
                    if (bVar76 != 0) {
                      iVar3 = *(int *)(local_870.hit + 4);
                      iVar4 = *(int *)(local_870.hit + 8);
                      iVar1 = *(int *)(local_870.hit + 0xc);
                      bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar70 >> 2) & 1);
                      bVar10 = SUB81(uVar70 >> 3,0);
                      *(uint *)(local_870.ray + 0xc0) =
                           (uint)(bVar76 & 1) * *(int *)local_870.hit |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_870.ray + 0xc0);
                      *(uint *)(local_870.ray + 0xc4) =
                           (uint)bVar8 * iVar3 | (uint)!bVar8 * *(int *)(local_870.ray + 0xc4);
                      *(uint *)(local_870.ray + 200) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_870.ray + 200);
                      *(uint *)(local_870.ray + 0xcc) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_870.ray + 0xcc);
                      iVar3 = *(int *)(local_870.hit + 0x14);
                      iVar4 = *(int *)(local_870.hit + 0x18);
                      iVar1 = *(int *)(local_870.hit + 0x1c);
                      bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar70 >> 2) & 1);
                      bVar10 = SUB81(uVar70 >> 3,0);
                      *(uint *)(local_870.ray + 0xd0) =
                           (uint)(bVar76 & 1) * *(int *)(local_870.hit + 0x10) |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_870.ray + 0xd0);
                      *(uint *)(local_870.ray + 0xd4) =
                           (uint)bVar8 * iVar3 | (uint)!bVar8 * *(int *)(local_870.ray + 0xd4);
                      *(uint *)(local_870.ray + 0xd8) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_870.ray + 0xd8);
                      *(uint *)(local_870.ray + 0xdc) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_870.ray + 0xdc);
                      iVar3 = *(int *)(local_870.hit + 0x24);
                      iVar4 = *(int *)(local_870.hit + 0x28);
                      iVar1 = *(int *)(local_870.hit + 0x2c);
                      bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar70 >> 2) & 1);
                      bVar10 = SUB81(uVar70 >> 3,0);
                      *(uint *)(local_870.ray + 0xe0) =
                           (uint)(bVar76 & 1) * *(int *)(local_870.hit + 0x20) |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_870.ray + 0xe0);
                      *(uint *)(local_870.ray + 0xe4) =
                           (uint)bVar8 * iVar3 | (uint)!bVar8 * *(int *)(local_870.ray + 0xe4);
                      *(uint *)(local_870.ray + 0xe8) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_870.ray + 0xe8);
                      *(uint *)(local_870.ray + 0xec) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_870.ray + 0xec);
                      iVar3 = *(int *)(local_870.hit + 0x34);
                      iVar4 = *(int *)(local_870.hit + 0x38);
                      iVar1 = *(int *)(local_870.hit + 0x3c);
                      bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar70 >> 2) & 1);
                      bVar10 = SUB81(uVar70 >> 3,0);
                      *(uint *)(local_870.ray + 0xf0) =
                           (uint)(bVar76 & 1) * *(int *)(local_870.hit + 0x30) |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_870.ray + 0xf0);
                      *(uint *)(local_870.ray + 0xf4) =
                           (uint)bVar8 * iVar3 | (uint)!bVar8 * *(int *)(local_870.ray + 0xf4);
                      *(uint *)(local_870.ray + 0xf8) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_870.ray + 0xf8);
                      *(uint *)(local_870.ray + 0xfc) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_870.ray + 0xfc);
                      iVar3 = *(int *)(local_870.hit + 0x44);
                      iVar4 = *(int *)(local_870.hit + 0x48);
                      iVar1 = *(int *)(local_870.hit + 0x4c);
                      bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar70 >> 2) & 1);
                      bVar10 = SUB81(uVar70 >> 3,0);
                      *(uint *)(local_870.ray + 0x100) =
                           (uint)(bVar76 & 1) * *(int *)(local_870.hit + 0x40) |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_870.ray + 0x100);
                      *(uint *)(local_870.ray + 0x104) =
                           (uint)bVar8 * iVar3 | (uint)!bVar8 * *(int *)(local_870.ray + 0x104);
                      *(uint *)(local_870.ray + 0x108) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_870.ray + 0x108);
                      *(uint *)(local_870.ray + 0x10c) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_870.ray + 0x10c);
                      auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x50));
                      *(undefined1 (*) [16])(local_870.ray + 0x110) = auVar82;
                      auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x60));
                      *(undefined1 (*) [16])(local_870.ray + 0x120) = auVar82;
                      auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x70));
                      *(undefined1 (*) [16])(local_870.ray + 0x130) = auVar82;
                      auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x80));
                      *(undefined1 (*) [16])(local_870.ray + 0x140) = auVar82;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar168;
                  break;
                }
              }
              lVar72 = lVar72 + -1;
            } while (lVar72 != 0);
            uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar149._4_4_ = uVar138;
            auVar149._0_4_ = uVar138;
            auVar149._8_4_ = uVar138;
            auVar149._12_4_ = uVar138;
            auVar149._16_4_ = uVar138;
            auVar149._20_4_ = uVar138;
            auVar149._24_4_ = uVar138;
            auVar149._28_4_ = uVar138;
            auVar62._4_4_ = fStack_35c;
            auVar62._0_4_ = local_360;
            auVar62._8_4_ = fStack_358;
            auVar62._12_4_ = fStack_354;
            auVar62._16_4_ = fStack_350;
            auVar62._20_4_ = fStack_34c;
            auVar62._24_4_ = fStack_348;
            auVar62._28_4_ = fStack_344;
            uVar16 = vcmpps_avx512vl(auVar149,auVar62,0xd);
            bVar73 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar73 & (byte)uVar16;
          } while (bVar73 != 0);
          auVar251 = ZEXT3264(local_700);
          auVar127 = local_380;
          fVar137 = (float)local_6c0._0_4_;
          fVar166 = (float)local_6c0._4_4_;
          fVar168 = fStack_6b8;
          fVar170 = fStack_6b4;
          fVar151 = fStack_6b0;
          fVar172 = fStack_6ac;
          fVar174 = fStack_6a8;
          fVar204 = fStack_6a4;
        }
        auVar216 = ZEXT3264(local_6e0);
        uVar18 = vpcmpgtd_avx512vl(auVar127,local_320);
        uVar19 = vpcmpd_avx512vl(local_320,local_2a0,1);
        auVar202._0_4_ = fVar137 + (float)local_200._0_4_;
        auVar202._4_4_ = fVar166 + (float)local_200._4_4_;
        auVar202._8_4_ = fVar168 + fStack_1f8;
        auVar202._12_4_ = fVar170 + fStack_1f4;
        auVar202._16_4_ = fVar151 + fStack_1f0;
        auVar202._20_4_ = fVar172 + fStack_1ec;
        auVar202._24_4_ = fVar174 + fStack_1e8;
        auVar202._28_4_ = fVar204 + fStack_1e4;
        uVar16 = vcmpps_avx512vl(auVar202,auVar149,2);
        bVar67 = bVar67 & (byte)uVar19 & (byte)uVar16;
        auVar203._0_4_ = fVar137 + local_300._0_4_;
        auVar203._4_4_ = fVar166 + local_300._4_4_;
        auVar203._8_4_ = fVar168 + local_300._8_4_;
        auVar203._12_4_ = fVar170 + local_300._12_4_;
        auVar203._16_4_ = fVar151 + local_300._16_4_;
        auVar203._20_4_ = fVar172 + local_300._20_4_;
        auVar203._24_4_ = fVar174 + local_300._24_4_;
        auVar203._28_4_ = fVar204 + local_300._28_4_;
        uVar16 = vcmpps_avx512vl(auVar203,auVar149,2);
        bVar65 = bVar65 & (byte)uVar18 & (byte)uVar16 | bVar67;
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar254 = ZEXT3264(auVar95);
        auVar230 = ZEXT3264(local_560);
        prim = local_610;
        if (bVar65 != 0) {
          abStack_180[uVar68 * 0x60] = bVar65;
          auVar129._0_4_ =
               (uint)(bVar67 & 1) * local_200._0_4_ |
               (uint)!(bool)(bVar67 & 1) * (int)local_300._0_4_;
          bVar8 = (bool)(bVar67 >> 1 & 1);
          auVar129._4_4_ = (uint)bVar8 * local_200._4_4_ | (uint)!bVar8 * (int)local_300._4_4_;
          bVar8 = (bool)(bVar67 >> 2 & 1);
          auVar129._8_4_ = (uint)bVar8 * (int)fStack_1f8 | (uint)!bVar8 * (int)local_300._8_4_;
          bVar8 = (bool)(bVar67 >> 3 & 1);
          auVar129._12_4_ = (uint)bVar8 * (int)fStack_1f4 | (uint)!bVar8 * (int)local_300._12_4_;
          bVar8 = (bool)(bVar67 >> 4 & 1);
          auVar129._16_4_ = (uint)bVar8 * (int)fStack_1f0 | (uint)!bVar8 * (int)local_300._16_4_;
          bVar8 = (bool)(bVar67 >> 5 & 1);
          auVar129._20_4_ = (uint)bVar8 * (int)fStack_1ec | (uint)!bVar8 * (int)local_300._20_4_;
          auVar129._24_4_ =
               (uint)(bVar67 >> 6) * (int)fStack_1e8 |
               (uint)!(bool)(bVar67 >> 6) * (int)local_300._24_4_;
          auVar129._28_4_ = local_300._28_4_;
          *(undefined1 (*) [32])(auStack_160 + uVar68 * 0x60) = auVar129;
          uVar70 = vmovlps_avx(local_330);
          (&uStack_140)[uVar68 * 0xc] = uVar70;
          aiStack_138[uVar68 * 0x18] = iVar69 + 1;
          uVar68 = (ulong)((int)uVar68 + 1);
        }
      }
    }
    do {
      uVar79 = (uint)uVar68;
      uVar68 = (ulong)(uVar79 - 1);
      if (uVar79 == 0) {
        uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar41._4_4_ = uVar138;
        auVar41._0_4_ = uVar138;
        auVar41._8_4_ = uVar138;
        auVar41._12_4_ = uVar138;
        auVar41._16_4_ = uVar138;
        auVar41._20_4_ = uVar138;
        auVar41._24_4_ = uVar138;
        auVar41._28_4_ = uVar138;
        uVar16 = vcmpps_avx512vl(local_280,auVar41,2);
        uVar71 = (uint)local_608 & (uint)uVar16;
        local_608 = (ulong)uVar71;
        if (uVar71 == 0) {
          return;
        }
        goto LAB_01d452e8;
      }
      lVar72 = uVar68 * 0x60;
      auVar95 = *(undefined1 (*) [32])(auStack_160 + lVar72);
      auVar162._0_4_ = fVar137 + auVar95._0_4_;
      auVar162._4_4_ = fVar166 + auVar95._4_4_;
      auVar162._8_4_ = fVar168 + auVar95._8_4_;
      auVar162._12_4_ = fVar170 + auVar95._12_4_;
      auVar162._16_4_ = fVar151 + auVar95._16_4_;
      auVar162._20_4_ = fVar172 + auVar95._20_4_;
      auVar162._24_4_ = fVar174 + auVar95._24_4_;
      auVar162._28_4_ = fVar204 + auVar95._28_4_;
      uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar40._4_4_ = uVar138;
      auVar40._0_4_ = uVar138;
      auVar40._8_4_ = uVar138;
      auVar40._12_4_ = uVar138;
      auVar40._16_4_ = uVar138;
      auVar40._20_4_ = uVar138;
      auVar40._24_4_ = uVar138;
      auVar40._28_4_ = uVar138;
      uVar16 = vcmpps_avx512vl(auVar162,auVar40,2);
      uVar78 = (uint)uVar16 & (uint)abStack_180[lVar72];
    } while (uVar78 == 0);
    uVar70 = (&uStack_140)[uVar68 * 0xc];
    auVar153._8_8_ = 0;
    auVar153._0_8_ = uVar70;
    auVar200._8_4_ = 0x7f800000;
    auVar200._0_8_ = 0x7f8000007f800000;
    auVar200._12_4_ = 0x7f800000;
    auVar200._16_4_ = 0x7f800000;
    auVar200._20_4_ = 0x7f800000;
    auVar200._24_4_ = 0x7f800000;
    auVar200._28_4_ = 0x7f800000;
    auVar93 = vblendmps_avx512vl(auVar200,auVar95);
    bVar65 = (byte)uVar78;
    auVar125._0_4_ =
         (uint)(bVar65 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar65 & 1) * (int)auVar95._0_4_;
    bVar8 = (bool)((byte)(uVar78 >> 1) & 1);
    auVar125._4_4_ = (uint)bVar8 * auVar93._4_4_ | (uint)!bVar8 * (int)auVar95._4_4_;
    bVar8 = (bool)((byte)(uVar78 >> 2) & 1);
    auVar125._8_4_ = (uint)bVar8 * auVar93._8_4_ | (uint)!bVar8 * (int)auVar95._8_4_;
    bVar8 = (bool)((byte)(uVar78 >> 3) & 1);
    auVar125._12_4_ = (uint)bVar8 * auVar93._12_4_ | (uint)!bVar8 * (int)auVar95._12_4_;
    bVar8 = (bool)((byte)(uVar78 >> 4) & 1);
    auVar125._16_4_ = (uint)bVar8 * auVar93._16_4_ | (uint)!bVar8 * (int)auVar95._16_4_;
    bVar8 = (bool)((byte)(uVar78 >> 5) & 1);
    auVar125._20_4_ = (uint)bVar8 * auVar93._20_4_ | (uint)!bVar8 * (int)auVar95._20_4_;
    bVar8 = (bool)((byte)(uVar78 >> 6) & 1);
    auVar125._24_4_ = (uint)bVar8 * auVar93._24_4_ | (uint)!bVar8 * (int)auVar95._24_4_;
    auVar125._28_4_ =
         (uVar78 >> 7) * auVar93._28_4_ | (uint)!SUB41(uVar78 >> 7,0) * (int)auVar95._28_4_;
    auVar95 = vshufps_avx(auVar125,auVar125,0xb1);
    auVar95 = vminps_avx(auVar125,auVar95);
    auVar93 = vshufpd_avx(auVar95,auVar95,5);
    auVar95 = vminps_avx(auVar95,auVar93);
    auVar93 = vpermpd_avx2(auVar95,0x4e);
    auVar95 = vminps_avx(auVar95,auVar93);
    uVar16 = vcmpps_avx512vl(auVar125,auVar95,0);
    bVar67 = (byte)uVar16 & bVar65;
    if (bVar67 != 0) {
      uVar78 = (uint)bVar67;
    }
    uVar130 = 0;
    for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
      uVar130 = uVar130 + 1;
    }
    iVar69 = aiStack_138[uVar68 * 0x18];
    bVar65 = ~('\x01' << ((byte)uVar130 & 0x1f)) & bVar65;
    abStack_180[lVar72] = bVar65;
    if (bVar65 == 0) {
      uVar79 = uVar79 - 1;
    }
    uVar138 = (undefined4)uVar70;
    auVar146._4_4_ = uVar138;
    auVar146._0_4_ = uVar138;
    auVar146._8_4_ = uVar138;
    auVar146._12_4_ = uVar138;
    auVar146._16_4_ = uVar138;
    auVar146._20_4_ = uVar138;
    auVar146._24_4_ = uVar138;
    auVar146._28_4_ = uVar138;
    auVar82 = vmovshdup_avx(auVar153);
    auVar82 = vsubps_avx(auVar82,auVar153);
    auVar163._0_4_ = auVar82._0_4_;
    auVar163._4_4_ = auVar163._0_4_;
    auVar163._8_4_ = auVar163._0_4_;
    auVar163._12_4_ = auVar163._0_4_;
    auVar163._16_4_ = auVar163._0_4_;
    auVar163._20_4_ = auVar163._0_4_;
    auVar163._24_4_ = auVar163._0_4_;
    auVar163._28_4_ = auVar163._0_4_;
    auVar82 = vfmadd132ps_fma(auVar163,auVar146,_DAT_01faff20);
    _local_460 = ZEXT1632(auVar82);
    local_330._8_8_ = 0;
    local_330._0_8_ = *(ulong *)(local_460 + (ulong)uVar130 * 4);
    uVar68 = (ulong)uVar79;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }